

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::SubdivPatch1MBIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  long lVar1;
  long lVar2;
  GridSOA *pGVar3;
  RTCIntersectArguments *pRVar4;
  BVH *bvh;
  size_t sVar5;
  Ref<embree::Geometry> *pRVar6;
  Geometry *pGVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  GridSOA *pGVar37;
  bool bVar38;
  uint uVar39;
  int iVar40;
  AABBNodeMB4D *node1;
  undefined1 *puVar41;
  ulong uVar42;
  GridSOA *pGVar43;
  RTCRayN *pRVar44;
  undefined8 uVar45;
  uint uVar46;
  undefined4 uVar47;
  RTCIntersectArguments *pRVar48;
  ulong uVar49;
  Primitive_conflict3 *prim;
  NodeRef root;
  size_t sVar50;
  ulong uVar51;
  long lVar52;
  long lVar53;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar54;
  long lVar55;
  long lVar56;
  Intersectors *pIVar57;
  NodeRef *pNVar58;
  float fVar59;
  float fVar78;
  float fVar79;
  vint4 ai;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar80;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int iVar81;
  int iVar93;
  int iVar94;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  int iVar95;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar96;
  float fVar108;
  float fVar109;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar97;
  undefined1 auVar98 [16];
  float fVar110;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar111;
  float fVar112;
  float fVar120;
  float fVar122;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar115;
  float fVar121;
  float fVar123;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar124;
  float fVar125;
  float fVar131;
  float fVar134;
  vint4 ai_1;
  undefined1 auVar126 [16];
  float fVar132;
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar139;
  float fVar144;
  float fVar145;
  vint4 ai_3;
  undefined1 auVar140 [16];
  float fVar146;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar147;
  float fVar148;
  float fVar153;
  float fVar155;
  vint4 bi;
  float fVar154;
  float fVar156;
  float fVar157;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar158;
  float fVar159;
  float fVar164;
  float fVar166;
  vint4 bi_3;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar165;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  uint uVar170;
  float fVar171;
  float fVar172;
  uint uVar176;
  float fVar179;
  vint4 bi_1;
  float fVar177;
  float fVar178;
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar183;
  float fVar191;
  float fVar195;
  vint4 ai_2;
  float fVar184;
  uint uVar185;
  float fVar192;
  uint uVar193;
  uint uVar196;
  float fVar198;
  float fVar199;
  uint uVar200;
  undefined1 auVar187 [16];
  float fVar186;
  float fVar194;
  float fVar197;
  float fVar201;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  uint uVar202;
  uint uVar207;
  uint uVar210;
  vint4 bi_2;
  float fVar203;
  float fVar204;
  float fVar208;
  float fVar209;
  float fVar211;
  float fVar212;
  uint uVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  int iVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  int iVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  int iVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  int iVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  uint local_1c78;
  uint uStack_1c74;
  uint uStack_1c70;
  uint uStack_1c6c;
  undefined8 local_1c48;
  undefined8 uStack_1c40;
  float local_1c18;
  float fStack_1c14;
  float fStack_1c10;
  float fStack_1c0c;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 local_1bb8;
  float local_1b88;
  float fStack_1b84;
  float fStack_1b80;
  undefined1 local_1b68 [16];
  GridSOA *local_1b58;
  int local_1b50;
  undefined4 local_1b4c;
  undefined1 local_1b48 [8];
  undefined8 uStack_1b40;
  undefined1 local_1b38 [8];
  float fStack_1b30;
  float fStack_1b2c;
  vbool<4> terminated;
  Precalculations pre;
  undefined8 uStack_1b00;
  RTCFilterFunctionNArguments args;
  vint<4> vitime;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  float local_19a8;
  float fStack_19a4;
  float fStack_19a0;
  float fStack_199c;
  undefined1 local_1998 [8];
  float fStack_1990;
  float fStack_198c;
  uint local_1988;
  uint uStack_1984;
  uint uStack_1980;
  uint uStack_197c;
  uint local_1978;
  uint uStack_1974;
  uint uStack_1970;
  uint uStack_196c;
  uint local_1968;
  uint uStack_1964;
  uint uStack_1960;
  uint uStack_195c;
  uint local_1958;
  uint uStack_1954;
  uint uStack_1950;
  uint uStack_194c;
  TravRayK<4,_false> tray;
  uint local_1838;
  uint uStack_1834;
  uint uStack_1830;
  uint uStack_182c;
  undefined1 local_1828 [16];
  undefined1 local_1818 [16];
  undefined1 local_1808 [16];
  float local_17f8;
  float fStack_17f4;
  float fStack_17f0;
  float fStack_17ec;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined1 local_17b8 [16];
  undefined1 local_17a8 [16];
  undefined1 local_1798 [16];
  float local_1788;
  float fStack_1784;
  float fStack_1780;
  float fStack_177c;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1740;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar116 [16];
  undefined1 auVar173 [16];
  
  uVar36 = mm_lookupmask_ps._8_8_;
  uVar35 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar98._8_4_ = 0xffffffff;
    auVar98._0_8_ = 0xffffffffffffffff;
    auVar98._12_4_ = 0xffffffff;
    auVar113 = *(undefined1 (*) [16])(ray + 0x80);
    auVar67._0_12_ = ZEXT812(0);
    auVar67._12_4_ = 0;
    uVar170 = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar113._0_4_);
    uVar176 = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar113._4_4_);
    auVar173._0_8_ = CONCAT44(uVar176,uVar170);
    auVar173._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar113._8_4_);
    auVar173._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar113._12_4_);
    uVar46 = movmskps((int)context,auVar173);
    pRVar48 = (RTCIntersectArguments *)(ulong)uVar46;
    if (uVar46 != 0) {
      pre.super_Precalculations.grid = (GridSOA *)0x0;
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar183 = (float)DAT_01f80d30;
      fVar191 = DAT_01f80d30._4_4_;
      fVar195 = DAT_01f80d30._8_4_;
      fVar198 = DAT_01f80d30._12_4_;
      auVar60._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar191);
      auVar60._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar183);
      auVar60._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar195);
      auVar60._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar198);
      auVar160 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01f80d30,auVar60
                         );
      auVar82._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar191);
      auVar82._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar183);
      auVar82._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar195);
      auVar82._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar198);
      auVar82 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01f80d30,auVar82)
      ;
      auVar206._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar191);
      auVar206._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar183);
      auVar206._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar195);
      auVar206._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar198);
      auVar140 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01f80d30,
                          auVar206);
      auVar60 = rcpps(auVar206,auVar160);
      fVar183 = auVar60._0_4_;
      auVar161._0_4_ = auVar160._0_4_ * fVar183;
      fVar191 = auVar60._4_4_;
      auVar161._4_4_ = auVar160._4_4_ * fVar191;
      fVar195 = auVar60._8_4_;
      auVar161._8_4_ = auVar160._8_4_ * fVar195;
      fVar198 = auVar60._12_4_;
      auVar161._12_4_ = auVar160._12_4_ * fVar198;
      fVar184 = (float)DAT_01f7ba10;
      fVar192 = DAT_01f7ba10._4_4_;
      fVar199 = DAT_01f7ba10._12_4_;
      fVar80 = DAT_01f7ba10._8_4_;
      tray.rdir.field_0._0_4_ = (fVar184 - auVar161._0_4_) * fVar183 + fVar183;
      tray.rdir.field_0._4_4_ = (fVar192 - auVar161._4_4_) * fVar191 + fVar191;
      tray.rdir.field_0._8_4_ = (fVar80 - auVar161._8_4_) * fVar195 + fVar195;
      tray.rdir.field_0._12_4_ = (fVar199 - auVar161._12_4_) * fVar198 + fVar198;
      auVar60 = rcpps(auVar161,auVar82);
      fVar183 = auVar60._0_4_;
      fVar191 = auVar60._4_4_;
      fVar195 = auVar60._8_4_;
      fVar198 = auVar60._12_4_;
      tray.rdir.field_0._16_4_ = (fVar184 - auVar82._0_4_ * fVar183) * fVar183 + fVar183;
      tray.rdir.field_0._20_4_ = (fVar192 - auVar82._4_4_ * fVar191) * fVar191 + fVar191;
      tray.rdir.field_0._24_4_ = (fVar80 - auVar82._8_4_ * fVar195) * fVar195 + fVar195;
      tray.rdir.field_0._28_4_ = (fVar199 - auVar82._12_4_ * fVar198) * fVar198 + fVar198;
      auVar60 = rcpps(auVar60,auVar140);
      fVar183 = auVar60._0_4_;
      fVar191 = auVar60._4_4_;
      fVar195 = auVar60._8_4_;
      fVar198 = auVar60._12_4_;
      tray.rdir.field_0._32_4_ = (fVar184 - auVar140._0_4_ * fVar183) * fVar183 + fVar183;
      tray.rdir.field_0._36_4_ = (fVar192 - auVar140._4_4_ * fVar191) * fVar191 + fVar191;
      tray.rdir.field_0._40_4_ = (fVar80 - auVar140._8_4_ * fVar195) * fVar195 + fVar195;
      tray.rdir.field_0._44_4_ = (fVar199 - auVar140._12_4_ * fVar198) * fVar198 + fVar198;
      tray.nearXYZ.field_0._0_8_ =
           CONCAT44(-(uint)((float)tray.rdir.field_0._4_4_ < 0.0),
                    -(uint)((float)tray.rdir.field_0._0_4_ < 0.0)) & 0x1000000010;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar140._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar140._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar140._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar140._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeed0,_DAT_01f8c1f0,auVar140);
      auVar160._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar160._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar160._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar160._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeef0,_DAT_01faeee0,auVar160);
      auVar60 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar67);
      iVar246 = (int)DAT_01f7a9f0;
      iVar250 = DAT_01f7a9f0._4_4_;
      iVar254 = DAT_01f7a9f0._8_4_;
      iVar258 = DAT_01f7a9f0._12_4_;
      auVar61._8_4_ = auVar173._8_4_;
      auVar61._0_8_ = auVar173._0_8_;
      auVar61._12_4_ = auVar173._12_4_;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f7a9f0,auVar60,auVar61);
      auVar113 = maxps(auVar113,auVar67);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f7aa00,auVar113,auVar61);
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar98 ^ auVar173);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar46 = 3;
      }
      else {
        pRVar48 = (RTCIntersectArguments *)
                  (CONCAT71((int7)((ulong)context->args >> 8),
                            *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01);
        uVar46 = ((char)pRVar48 == '\0') + 2;
      }
      pNVar58 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar54 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      puVar41 = mm_lookupmask_ps;
LAB_00dbf33f:
      do {
        do {
          root.ptr = pNVar58[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00dc0f4a;
          pNVar58 = pNVar58 + -1;
          paVar54 = paVar54 + -1;
          aVar97.v = *(__m128 *)paVar54->v;
          auVar113._4_4_ = -(uint)(aVar97._4_4_ < tray.tfar.field_0.v[1]);
          auVar113._0_4_ = -(uint)(aVar97._0_4_ < tray.tfar.field_0.v[0]);
          auVar113._8_4_ = -(uint)(aVar97._8_4_ < tray.tfar.field_0.v[2]);
          auVar113._12_4_ = -(uint)(aVar97._12_4_ < tray.tfar.field_0.v[3]);
          uVar39 = movmskps((int)puVar41,auVar113);
          puVar41 = (undefined1 *)(ulong)uVar39;
        } while (uVar39 == 0);
        uVar42 = (ulong)(byte)uVar39;
        if (uVar46 < (uint)POPCOUNT(uVar39 & 0xff)) {
LAB_00dbf389:
          do {
            uVar39 = (uint)root.ptr;
            fVar183 = aVar97.v[0];
            fVar191 = aVar97.v[1];
            fVar195 = aVar97.v[2];
            fVar198 = aVar97.v[3];
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00dc0f4a;
              auVar64._4_4_ = -(uint)(fVar191 < tray.tfar.field_0.v[1]);
              auVar64._0_4_ = -(uint)(fVar183 < tray.tfar.field_0.v[0]);
              auVar64._8_4_ = -(uint)(fVar195 < tray.tfar.field_0.v[2]);
              auVar64._12_4_ = -(uint)(fVar198 < tray.tfar.field_0.v[3]);
              uVar185 = movmskps((int)puVar41,auVar64);
              puVar41 = (undefined1 *)(ulong)uVar185;
              if (uVar185 != 0) {
                if ((uVar39 & 0xf) == 8) {
                  fVar183 = (float)(*(int *)(pre.super_Precalculations.grid + 8) - 1U);
                  auVar65._0_4_ = fVar183 * *(float *)(ray + 0x70);
                  auVar65._4_4_ = fVar183 * *(float *)(ray + 0x74);
                  auVar65._8_4_ = fVar183 * *(float *)(ray + 0x78);
                  auVar65._12_4_ = fVar183 * *(float *)(ray + 0x7c);
                  auVar113 = roundps(auVar65,auVar65,1);
                  auVar83._0_4_ = fVar183 + -1.0;
                  auVar83._4_4_ = auVar83._0_4_;
                  auVar83._8_4_ = auVar83._0_4_;
                  auVar83._12_4_ = auVar83._0_4_;
                  auVar113 = minps(auVar113,auVar83);
                  auVar113 = maxps(auVar113,_DAT_01f7aa10);
                  iVar81 = (int)auVar113._0_4_;
                  iVar93 = (int)auVar113._4_4_;
                  iVar94 = (int)auVar113._8_4_;
                  iVar95 = (int)auVar113._12_4_;
                  vitime.field_0.i[0] = iVar81;
                  vitime.field_0.i[1] = iVar93;
                  vitime.field_0.i[2] = iVar94;
                  vitime.field_0.i[3] = iVar95;
                  uVar39 = movmskps(*(int *)(pre.super_Precalculations.grid + 8) - 1U,
                                    (undefined1  [16])terminated.field_0);
                  uVar39 = uVar39 ^ 0xf;
                  if (uVar39 == 0) {
                    local_1bb8 = terminated.field_0;
                  }
                  else {
                    fVar80 = auVar65._0_4_ - auVar113._0_4_;
                    fVar184 = auVar65._4_4_ - auVar113._4_4_;
                    fVar192 = auVar65._8_4_ - auVar113._8_4_;
                    fVar199 = auVar65._12_4_ - auVar113._12_4_;
                    local_1bb8._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                    local_1bb8.i[2] = terminated.field_0._8_4_ ^ 0xffffffff;
                    local_1bb8.i[3] = terminated.field_0._12_4_ ^ 0xffffffff;
                    fVar183 = 1.0 - fVar80;
                    fVar191 = 1.0 - fVar184;
                    fVar195 = 1.0 - fVar192;
                    fVar198 = 1.0 - fVar199;
                    uVar42 = root.ptr >> 2 & 0xfffffffffffffffc;
                    auVar126._8_4_ = local_1bb8.i[2];
                    auVar126._0_8_ = local_1bb8._0_8_;
                    auVar126._12_4_ = local_1bb8.i[3];
                    do {
                      pGVar37 = pre.super_Precalculations.grid;
                      lVar8 = 0;
                      if ((uVar39 & 0xf) != 0) {
                        for (; ((uVar39 & 0xf) >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
                        }
                      }
                      iVar40 = vitime.field_0.i[(int)lVar8];
                      auVar66._0_4_ = -(uint)(iVar40 == iVar81);
                      auVar66._4_4_ = -(uint)(iVar40 == iVar93);
                      auVar66._8_4_ = -(uint)(iVar40 == iVar94);
                      auVar66._12_4_ = -(uint)(iVar40 == iVar95);
                      auVar66 = auVar66 & auVar126;
                      auVar98 = auVar66 ^ _DAT_01f7ae20;
                      uVar49 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x14);
                      local_1b50 = *(int *)(pre.super_Precalculations.grid + 0x10);
                      lVar56 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x28) *
                               (long)iVar40 +
                               (ulong)*(uint *)(pre.super_Precalculations.grid + 0x24);
                      valid_i = (vint<4> *)
                                ((ulong)((ulong)*(uint *)(pre.super_Precalculations.grid + 0xc) != 2
                                        ) * 4 + 4);
                      uVar51 = (ulong)(*(uint *)(pre.super_Precalculations.grid + 0x28) & 0xfffffffc
                                      );
                      lVar8 = lVar56 + uVar51;
                      lVar25 = uVar49 * 0xc + lVar8 + uVar42;
                      lVar52 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0xc) * 4;
                      lVar1 = lVar56 + uVar49 * 8;
                      lVar26 = uVar51 + lVar1 + uVar42;
                      lVar27 = uVar49 * 4 + lVar8 + uVar42;
                      lVar2 = lVar56 + uVar49 * 4;
                      pGVar43 = pre.super_Precalculations.grid + uVar42 + 0x2c;
                      uVar45 = CONCAT71((int7)((ulong)pGVar43 >> 8),1);
                      lVar55 = 0;
                      auVar113 = auVar66;
                      do {
                        local_1b4c = (undefined4)uVar45;
                        lVar53 = (lVar55 + 1) * lVar52;
                        lVar28 = lVar53 + lVar25;
                        lVar30 = lVar53 + lVar26;
                        lVar31 = lVar53 + lVar27;
                        lVar32 = lVar53 + lVar8 + uVar42;
                        lVar34 = lVar53 + lVar56 + uVar42;
                        lVar55 = lVar55 * lVar52;
                        lVar29 = lVar55 + lVar25;
                        pGVar3 = pGVar37 + lVar55 + lVar26;
                        pRVar4 = (RTCIntersectArguments *)(pGVar37 + lVar55 + lVar27);
                        lVar33 = lVar55 + lVar8 + uVar42;
                        local_1b58 = pGVar43 + lVar55 + lVar56;
                        pIVar57 = (Intersectors *)0x0;
                        pRVar48 = pRVar4;
                        do {
                          if ((Intersectors *)valid_i == pIVar57) break;
                          fVar158 = *(float *)(local_1b58 + (long)pIVar57);
                          fVar139 = *(float *)(local_1b58 + 4 + (long)pIVar57);
                          fVar146 = *(float *)(pGVar43 + lVar55 + lVar2 + (long)pIVar57);
                          fVar147 = *(float *)(pGVar43 + lVar55 + lVar2 + 4 + (long)pIVar57);
                          fVar164 = *(float *)(pGVar43 + lVar55 + lVar1 + (long)pIVar57);
                          fVar166 = *(float *)(pGVar43 + lVar55 + lVar1 + 4 + (long)pIVar57);
                          fVar168 = *(float *)(pGVar37 + lVar34 + 0x2c + (long)pIVar57);
                          fVar96 = *(float *)(pGVar37 + lVar53 + lVar2 + uVar42 + 0x30 + -4 +
                                             (long)pIVar57);
                          fVar108 = *(float *)(pGVar37 + lVar53 + lVar1 + uVar42 + 0x30 + -4 +
                                              (long)pIVar57);
                          fVar216 = *(float *)(pGVar37 + lVar33 + 0x2c + (long)pIVar57);
                          fVar109 = *(float *)(pGVar37 + lVar33 + 0x30 + (long)pIVar57);
                          fVar241 = *(float *)((undefined1 *)((long)&pRVar4[1].context + 4) +
                                              (long)pIVar57);
                          fVar59 = *(float *)((long)&pRVar4[1].filter + (long)pIVar57);
                          fVar78 = *(float *)(pGVar3 + 0x2c + (long)pIVar57);
                          fVar79 = *(float *)(pGVar3 + 0x30 + (long)pIVar57);
                          fVar131 = *(float *)(pGVar37 + lVar32 + 0x2c + (long)pIVar57);
                          fVar134 = *(float *)(pGVar37 + lVar31 + 0x2c + (long)pIVar57);
                          fVar144 = *(float *)(pGVar37 + lVar30 + 0x2c + (long)pIVar57);
                          fVar148 = fVar139 * fVar183 + fVar109 * fVar80;
                          fVar154 = fVar139 * fVar191 + fVar109 * fVar184;
                          fVar156 = fVar139 * fVar195 + fVar109 * fVar192;
                          fVar157 = fVar139 * fVar198 + fVar109 * fVar199;
                          fVar145 = fVar147 * fVar183 + fVar59 * fVar80;
                          fVar153 = fVar147 * fVar191 + fVar59 * fVar184;
                          fVar155 = fVar147 * fVar195 + fVar59 * fVar192;
                          fVar171 = fVar147 * fVar198 + fVar59 * fVar199;
                          fVar247 = fVar166 * fVar183 + fVar79 * fVar80;
                          fVar251 = fVar166 * fVar191 + fVar79 * fVar184;
                          fVar255 = fVar166 * fVar195 + fVar79 * fVar192;
                          fVar259 = fVar166 * fVar198 + fVar79 * fVar199;
                          fVar186 = fVar168 * fVar183 + fVar131 * fVar80;
                          fVar194 = fVar168 * fVar191 + fVar131 * fVar184;
                          fVar197 = fVar168 * fVar195 + fVar131 * fVar192;
                          fVar201 = fVar168 * fVar198 + fVar131 * fVar199;
                          fVar203 = fVar96 * fVar183 + fVar134 * fVar80;
                          fVar208 = fVar96 * fVar191 + fVar134 * fVar184;
                          fVar211 = fVar96 * fVar195 + fVar134 * fVar192;
                          fVar214 = fVar96 * fVar198 + fVar134 * fVar199;
                          fVar237 = fVar108 * fVar183 + fVar144 * fVar80;
                          fVar239 = fVar108 * fVar191 + fVar144 * fVar184;
                          fVar242 = fVar108 * fVar195 + fVar144 * fVar192;
                          fVar244 = fVar108 * fVar198 + fVar144 * fVar199;
                          fVar139 = *(float *)ray;
                          fVar147 = *(float *)(ray + 4);
                          fVar166 = *(float *)(ray + 8);
                          fVar168 = *(float *)(ray + 0xc);
                          fVar96 = *(float *)(ray + 0x10);
                          fVar108 = *(float *)(ray + 0x14);
                          fVar109 = *(float *)(ray + 0x18);
                          fVar59 = *(float *)(ray + 0x1c);
                          fVar79 = *(float *)(ray + 0x20);
                          fVar131 = *(float *)(ray + 0x24);
                          fVar134 = *(float *)(ray + 0x28);
                          fVar144 = *(float *)(ray + 0x2c);
                          local_1b48._0_4_ = (fVar158 * fVar183 + fVar216 * fVar80) - fVar139;
                          local_1b48._4_4_ = (fVar158 * fVar191 + fVar216 * fVar184) - fVar147;
                          uStack_1b40._0_4_ = (fVar158 * fVar195 + fVar216 * fVar192) - fVar166;
                          uStack_1b40._4_4_ = (fVar158 * fVar198 + fVar216 * fVar199) - fVar168;
                          local_1b38._0_4_ = (fVar146 * fVar183 + fVar241 * fVar80) - fVar96;
                          local_1b38._4_4_ = (fVar146 * fVar191 + fVar241 * fVar184) - fVar108;
                          fStack_1b30 = (fVar146 * fVar195 + fVar241 * fVar192) - fVar109;
                          fStack_1b2c = (fVar146 * fVar198 + fVar241 * fVar199) - fVar59;
                          fVar217 = (fVar164 * fVar183 + fVar78 * fVar80) - fVar79;
                          fVar220 = (fVar164 * fVar191 + fVar78 * fVar184) - fVar131;
                          fVar223 = (fVar164 * fVar195 + fVar78 * fVar192) - fVar134;
                          fVar226 = (fVar164 * fVar198 + fVar78 * fVar199) - fVar144;
                          fVar159 = fVar148 - fVar139;
                          fVar165 = fVar154 - fVar147;
                          fVar167 = fVar156 - fVar166;
                          fVar169 = fVar157 - fVar168;
                          fVar177 = fVar145 - fVar96;
                          fVar179 = fVar153 - fVar108;
                          fVar181 = fVar155 - fVar109;
                          fVar110 = fVar171 - fVar59;
                          fVar248 = fVar247 - fVar79;
                          fVar252 = fVar251 - fVar131;
                          fVar256 = fVar255 - fVar134;
                          fVar260 = fVar259 - fVar144;
                          fVar139 = fVar186 - fVar139;
                          fVar147 = fVar194 - fVar147;
                          fVar166 = fVar197 - fVar166;
                          fVar168 = fVar201 - fVar168;
                          fVar96 = fVar203 - fVar96;
                          fVar108 = fVar208 - fVar108;
                          fVar109 = fVar211 - fVar109;
                          fVar59 = fVar214 - fVar59;
                          fVar79 = fVar237 - fVar79;
                          fVar131 = fVar239 - fVar131;
                          fVar134 = fVar242 - fVar134;
                          fVar144 = fVar244 - fVar144;
                          fVar111 = fVar139 - (float)local_1b48._0_4_;
                          fVar120 = fVar147 - (float)local_1b48._4_4_;
                          fVar122 = fVar166 - (float)uStack_1b40;
                          fVar123 = fVar168 - uStack_1b40._4_4_;
                          fVar238 = fVar96 - (float)local_1b38._0_4_;
                          fVar240 = fVar108 - (float)local_1b38._4_4_;
                          fVar243 = fVar109 - fStack_1b30;
                          fVar245 = fVar59 - fStack_1b2c;
                          fVar204 = fVar79 - fVar217;
                          fVar209 = fVar131 - fVar220;
                          fVar212 = fVar134 - fVar223;
                          fVar215 = fVar144 - fVar226;
                          auVar23 = *(undefined1 (*) [12])(ray + 0x60);
                          fVar158 = *(float *)(ray + 0x6c);
                          auVar24 = *(undefined1 (*) [12])(ray + 0x50);
                          fVar146 = *(float *)(ray + 0x5c);
                          fVar164 = *(float *)(ray + 0x40);
                          fVar216 = *(float *)(ray + 0x44);
                          fVar241 = *(float *)(ray + 0x48);
                          fVar78 = *(float *)(ray + 0x4c);
                          fVar124 = (fVar238 * (fVar79 + fVar217) -
                                    (fVar96 + (float)local_1b38._0_4_) * fVar204) * fVar164 +
                                    ((fVar139 + (float)local_1b48._0_4_) * fVar204 -
                                    (fVar79 + fVar217) * fVar111) * *(float *)(ray + 0x50) +
                                    (fVar111 * (fVar96 + (float)local_1b38._0_4_) -
                                    (fVar139 + (float)local_1b48._0_4_) * fVar238) *
                                    *(float *)(ray + 0x60);
                          fVar132 = (fVar240 * (fVar131 + fVar220) -
                                    (fVar108 + (float)local_1b38._4_4_) * fVar209) * fVar216 +
                                    ((fVar147 + (float)local_1b48._4_4_) * fVar209 -
                                    (fVar131 + fVar220) * fVar120) * *(float *)(ray + 0x54) +
                                    (fVar120 * (fVar108 + (float)local_1b38._4_4_) -
                                    (fVar147 + (float)local_1b48._4_4_) * fVar240) *
                                    *(float *)(ray + 100);
                          fVar135 = (fVar243 * (fVar134 + fVar223) -
                                    (fVar109 + fStack_1b30) * fVar212) * fVar241 +
                                    ((fVar166 + (float)uStack_1b40) * fVar212 -
                                    (fVar134 + fVar223) * fVar122) * *(float *)(ray + 0x58) +
                                    (fVar122 * (fVar109 + fStack_1b30) -
                                    (fVar166 + (float)uStack_1b40) * fVar243) *
                                    *(float *)(ray + 0x68);
                          fVar137 = (fVar245 * (fVar144 + fVar226) -
                                    (fVar59 + fStack_1b2c) * fVar215) * fVar78 +
                                    ((fVar168 + uStack_1b40._4_4_) * fVar215 -
                                    (fVar144 + fVar226) * fVar123) * fVar146 +
                                    (fVar123 * (fVar59 + fStack_1b2c) -
                                    (fVar168 + uStack_1b40._4_4_) * fVar245) * fVar158;
                          fVar125 = (float)local_1b48._0_4_ - fVar159;
                          fVar133 = (float)local_1b48._4_4_ - fVar165;
                          fVar136 = (float)uStack_1b40 - fVar167;
                          fVar138 = uStack_1b40._4_4_ - fVar169;
                          fVar229 = (float)local_1b38._0_4_ - fVar177;
                          fVar230 = (float)local_1b38._4_4_ - fVar179;
                          fVar231 = fStack_1b30 - fVar181;
                          fVar232 = fStack_1b2c - fVar110;
                          fVar218 = fVar217 - fVar248;
                          fVar221 = fVar220 - fVar252;
                          fVar224 = fVar223 - fVar256;
                          fVar227 = fVar226 - fVar260;
                          local_1b88 = auVar23._0_4_;
                          fStack_1b84 = auVar23._4_4_;
                          fStack_1b80 = auVar23._8_4_;
                          local_1c18 = auVar24._0_4_;
                          fStack_1c14 = auVar24._4_4_;
                          fStack_1c10 = auVar24._8_4_;
                          fVar112 = (fVar229 * (fVar217 + fVar248) -
                                    ((float)local_1b38._0_4_ + fVar177) * fVar218) * fVar164 +
                                    (((float)local_1b48._0_4_ + fVar159) * fVar218 -
                                    (fVar217 + fVar248) * fVar125) * local_1c18 +
                                    (fVar125 * ((float)local_1b38._0_4_ + fVar177) -
                                    ((float)local_1b48._0_4_ + fVar159) * fVar229) * local_1b88;
                          fVar121 = (fVar230 * (fVar220 + fVar252) -
                                    ((float)local_1b38._4_4_ + fVar179) * fVar221) * fVar216 +
                                    (((float)local_1b48._4_4_ + fVar165) * fVar221 -
                                    (fVar220 + fVar252) * fVar133) * fStack_1c14 +
                                    (fVar133 * ((float)local_1b38._4_4_ + fVar179) -
                                    ((float)local_1b48._4_4_ + fVar165) * fVar230) * fStack_1b84;
                          auVar116._0_8_ = CONCAT44(fVar121,fVar112);
                          auVar116._8_4_ =
                               (fVar231 * (fVar223 + fVar256) - (fStack_1b30 + fVar181) * fVar224) *
                               fVar241 + (((float)uStack_1b40 + fVar167) * fVar224 -
                                         (fVar223 + fVar256) * fVar136) * fStack_1c10 +
                                         (fVar136 * (fStack_1b30 + fVar181) -
                                         ((float)uStack_1b40 + fVar167) * fVar231) * fStack_1b80;
                          auVar116._12_4_ =
                               (fVar232 * (fVar226 + fVar260) - (fStack_1b2c + fVar110) * fVar227) *
                               fVar78 + ((uStack_1b40._4_4_ + fVar169) * fVar227 -
                                        (fVar226 + fVar260) * fVar138) * fVar146 +
                                        (fVar138 * (fStack_1b2c + fVar110) -
                                        (uStack_1b40._4_4_ + fVar169) * fVar232) * fVar158;
                          fVar172 = fVar159 - fVar139;
                          fVar178 = fVar165 - fVar147;
                          fVar180 = fVar167 - fVar166;
                          fVar182 = fVar169 - fVar168;
                          fVar249 = fVar177 - fVar96;
                          fVar253 = fVar179 - fVar108;
                          fVar257 = fVar181 - fVar109;
                          fVar261 = fVar110 - fVar59;
                          fVar219 = fVar248 - fVar79;
                          fVar222 = fVar252 - fVar131;
                          fVar225 = fVar256 - fVar134;
                          fVar228 = fVar260 - fVar144;
                          fVar139 = (fVar249 * (fVar79 + fVar248) - (fVar96 + fVar177) * fVar219) *
                                    fVar164 + ((fVar139 + fVar159) * fVar219 -
                                              (fVar79 + fVar248) * fVar172) * local_1c18 +
                                              (fVar172 * (fVar96 + fVar177) -
                                              (fVar139 + fVar159) * fVar249) * local_1b88;
                          fVar147 = (fVar253 * (fVar131 + fVar252) - (fVar108 + fVar179) * fVar222)
                                    * fVar216 +
                                    ((fVar147 + fVar165) * fVar222 - (fVar131 + fVar252) * fVar178)
                                    * fStack_1c14 +
                                    (fVar178 * (fVar108 + fVar179) - (fVar147 + fVar165) * fVar253)
                                    * fStack_1b84;
                          fVar166 = (fVar257 * (fVar134 + fVar256) - (fVar109 + fVar181) * fVar225)
                                    * fVar241 +
                                    ((fVar166 + fVar167) * fVar225 - (fVar134 + fVar256) * fVar180)
                                    * fStack_1c10 +
                                    (fVar180 * (fVar109 + fVar181) - (fVar166 + fVar167) * fVar257)
                                    * fStack_1b80;
                          fVar168 = (fVar261 * (fVar144 + fVar260) - (fVar59 + fVar110) * fVar228) *
                                    fVar78 + ((fVar168 + fVar169) * fVar228 -
                                             (fVar144 + fVar260) * fVar182) * fVar146 +
                                             (fVar182 * (fVar59 + fVar110) -
                                             (fVar168 + fVar169) * fVar261) * fVar158;
                          auVar18._4_4_ = fVar132;
                          auVar18._0_4_ = fVar124;
                          auVar18._8_4_ = fVar135;
                          auVar18._12_4_ = fVar137;
                          fVar96 = fVar124 + fVar112 + fVar139;
                          fVar108 = fVar132 + fVar121 + fVar147;
                          uStack_1bd0._0_4_ = fVar135 + auVar116._8_4_ + fVar166;
                          uStack_1bd0._4_4_ = fVar137 + auVar116._12_4_ + fVar168;
                          auVar67 = minps(auVar18,auVar116);
                          auVar14._4_4_ = fVar147;
                          auVar14._0_4_ = fVar139;
                          auVar14._8_4_ = fVar166;
                          auVar14._12_4_ = fVar168;
                          auVar67 = minps(auVar67,auVar14);
                          auVar60 = maxps(auVar18,auVar116);
                          auVar15._4_4_ = fVar147;
                          auVar15._0_4_ = fVar139;
                          auVar15._8_4_ = fVar166;
                          auVar15._12_4_ = fVar168;
                          auVar60 = maxps(auVar60,auVar15);
                          fVar139 = ABS(fVar96) * 1.1920929e-07;
                          fVar147 = ABS(fVar108) * 1.1920929e-07;
                          fVar166 = ABS((float)uStack_1bd0) * 1.1920929e-07;
                          fVar168 = ABS(uStack_1bd0._4_4_) * 1.1920929e-07;
                          local_1c78 = auVar113._0_4_;
                          uStack_1c74 = auVar113._4_4_;
                          uStack_1c70 = auVar113._8_4_;
                          uStack_1c6c = auVar113._12_4_;
                          auVar162._0_8_ =
                               CONCAT44(-(uint)(auVar60._4_4_ <= fVar147 ||
                                               -fVar147 <= auVar67._4_4_) & uStack_1c74,
                                        -(uint)(auVar60._0_4_ <= fVar139 ||
                                               -fVar139 <= auVar67._0_4_) & local_1c78);
                          auVar162._8_4_ =
                               -(uint)(auVar60._8_4_ <= fVar166 || -fVar166 <= auVar67._8_4_) &
                               uStack_1c70;
                          auVar162._12_4_ =
                               -(uint)(auVar60._12_4_ <= fVar168 || -fVar168 <= auVar67._12_4_) &
                               uStack_1c6c;
                          iVar246 = movmskps((int)pGVar3,auVar162);
                          if (iVar246 == 0) {
                            auVar151._8_4_ = auVar162._8_4_;
                            auVar151._0_8_ = auVar162._0_8_;
                            auVar151._12_4_ = auVar162._12_4_;
                          }
                          else {
                            local_1bd8 = CONCAT44(fVar108,fVar96);
                            auVar141._0_4_ = fVar238 * fVar218 - fVar229 * fVar204;
                            auVar141._4_4_ = fVar240 * fVar221 - fVar230 * fVar209;
                            auVar141._8_4_ = fVar243 * fVar224 - fVar231 * fVar212;
                            auVar141._12_4_ = fVar245 * fVar227 - fVar232 * fVar215;
                            auVar205._0_4_ = fVar229 * fVar219 - fVar249 * fVar218;
                            auVar205._4_4_ = fVar230 * fVar222 - fVar253 * fVar221;
                            auVar205._8_4_ = fVar231 * fVar225 - fVar257 * fVar224;
                            auVar205._12_4_ = fVar232 * fVar228 - fVar261 * fVar227;
                            auVar68._4_4_ = -(uint)(ABS(fVar230 * fVar209) < ABS(fVar253 * fVar221))
                            ;
                            auVar68._0_4_ = -(uint)(ABS(fVar229 * fVar204) < ABS(fVar249 * fVar218))
                            ;
                            auVar68._8_4_ = -(uint)(ABS(fVar231 * fVar212) < ABS(fVar257 * fVar224))
                            ;
                            auVar68._12_4_ =
                                 -(uint)(ABS(fVar232 * fVar215) < ABS(fVar261 * fVar227));
                            auVar206 = blendvps(auVar205,auVar141,auVar68);
                            auVar174._0_4_ = fVar172 * fVar218 - fVar125 * fVar219;
                            auVar174._4_4_ = fVar178 * fVar221 - fVar133 * fVar222;
                            auVar174._8_4_ = fVar180 * fVar224 - fVar136 * fVar225;
                            auVar174._12_4_ = fVar182 * fVar227 - fVar138 * fVar228;
                            auVar69._4_4_ = -(uint)(ABS(fVar120 * fVar221) < ABS(fVar133 * fVar222))
                            ;
                            auVar69._0_4_ = -(uint)(ABS(fVar111 * fVar218) < ABS(fVar125 * fVar219))
                            ;
                            auVar69._8_4_ = -(uint)(ABS(fVar122 * fVar224) < ABS(fVar136 * fVar225))
                            ;
                            auVar69._12_4_ =
                                 -(uint)(ABS(fVar123 * fVar227) < ABS(fVar138 * fVar228));
                            auVar12._4_4_ = fVar209 * fVar133 - fVar120 * fVar221;
                            auVar12._0_4_ = fVar204 * fVar125 - fVar111 * fVar218;
                            auVar12._8_4_ = fVar212 * fVar136 - fVar122 * fVar224;
                            auVar12._12_4_ = fVar215 * fVar138 - fVar123 * fVar227;
                            auVar60 = blendvps(auVar174,auVar12,auVar69);
                            auVar233._0_4_ = fVar111 * fVar229 - fVar125 * fVar238;
                            auVar233._4_4_ = fVar120 * fVar230 - fVar133 * fVar240;
                            auVar233._8_4_ = fVar122 * fVar231 - fVar136 * fVar243;
                            auVar233._12_4_ = fVar123 * fVar232 - fVar138 * fVar245;
                            auVar188._0_4_ = fVar125 * fVar249 - fVar172 * fVar229;
                            auVar188._4_4_ = fVar133 * fVar253 - fVar178 * fVar230;
                            auVar188._8_4_ = fVar136 * fVar257 - fVar180 * fVar231;
                            auVar188._12_4_ = fVar138 * fVar261 - fVar182 * fVar232;
                            auVar70._4_4_ = -(uint)(ABS(fVar133 * fVar240) < ABS(fVar178 * fVar230))
                            ;
                            auVar70._0_4_ = -(uint)(ABS(fVar125 * fVar238) < ABS(fVar172 * fVar229))
                            ;
                            auVar70._8_4_ = -(uint)(ABS(fVar136 * fVar243) < ABS(fVar180 * fVar231))
                            ;
                            auVar70._12_4_ =
                                 -(uint)(ABS(fVar138 * fVar245) < ABS(fVar182 * fVar232));
                            auVar82 = blendvps(auVar188,auVar233,auVar70);
                            fVar139 = fVar164 * auVar206._0_4_ +
                                      local_1c18 * auVar60._0_4_ + local_1b88 * auVar82._0_4_;
                            fVar147 = fVar216 * auVar206._4_4_ +
                                      fStack_1c14 * auVar60._4_4_ + fStack_1b84 * auVar82._4_4_;
                            fVar164 = fVar241 * auVar206._8_4_ +
                                      fStack_1c10 * auVar60._8_4_ + fStack_1b80 * auVar82._8_4_;
                            fVar158 = fVar78 * auVar206._12_4_ +
                                      fVar146 * auVar60._12_4_ + fVar158 * auVar82._12_4_;
                            auVar149._0_4_ = fVar139 + fVar139;
                            auVar149._4_4_ = fVar147 + fVar147;
                            auVar149._8_4_ = fVar164 + fVar164;
                            auVar149._12_4_ = fVar158 + fVar158;
                            auVar84._0_4_ = fVar217 * auVar82._0_4_;
                            auVar84._4_4_ = fVar220 * auVar82._4_4_;
                            auVar84._8_4_ = fVar223 * auVar82._8_4_;
                            auVar84._12_4_ = fVar226 * auVar82._12_4_;
                            fVar164 = (float)local_1b48._0_4_ * auVar206._0_4_ +
                                      (float)local_1b38._0_4_ * auVar60._0_4_ + auVar84._0_4_;
                            fVar166 = (float)local_1b48._4_4_ * auVar206._4_4_ +
                                      (float)local_1b38._4_4_ * auVar60._4_4_ + auVar84._4_4_;
                            fVar168 = (float)uStack_1b40 * auVar206._8_4_ +
                                      fStack_1b30 * auVar60._8_4_ + auVar84._8_4_;
                            fVar96 = uStack_1b40._4_4_ * auVar206._12_4_ +
                                     fStack_1b2c * auVar60._12_4_ + auVar84._12_4_;
                            auVar67 = rcpps(auVar84,auVar149);
                            fVar158 = auVar67._0_4_;
                            fVar139 = auVar67._4_4_;
                            fVar146 = auVar67._8_4_;
                            fVar147 = auVar67._12_4_;
                            fVar158 = ((1.0 - auVar149._0_4_ * fVar158) * fVar158 + fVar158) *
                                      (fVar164 + fVar164);
                            fVar139 = ((1.0 - auVar149._4_4_ * fVar139) * fVar139 + fVar139) *
                                      (fVar166 + fVar166);
                            fVar146 = ((1.0 - auVar149._8_4_ * fVar146) * fVar146 + fVar146) *
                                      (fVar168 + fVar168);
                            fVar147 = ((1.0 - auVar149._12_4_ * fVar147) * fVar147 + fVar147) *
                                      (fVar96 + fVar96);
                            auVar150._0_4_ =
                                 (int)((uint)((fVar158 <= *(float *)(ray + 0x80) &&
                                              *(float *)(ray + 0x30) <= fVar158) &&
                                             auVar149._0_4_ != 0.0) * -0x80000000) >> 0x1f;
                            auVar150._4_4_ =
                                 (int)((uint)((fVar139 <= *(float *)(ray + 0x84) &&
                                              *(float *)(ray + 0x34) <= fVar139) &&
                                             auVar149._4_4_ != 0.0) * -0x80000000) >> 0x1f;
                            auVar150._8_4_ =
                                 (int)((uint)((fVar146 <= *(float *)(ray + 0x88) &&
                                              *(float *)(ray + 0x38) <= fVar146) &&
                                             auVar149._8_4_ != 0.0) * -0x80000000) >> 0x1f;
                            auVar150._12_4_ =
                                 (int)((uint)((fVar147 <= *(float *)(ray + 0x8c) &&
                                              *(float *)(ray + 0x3c) <= fVar147) &&
                                             auVar149._12_4_ != 0.0) * -0x80000000) >> 0x1f;
                            auVar151 = auVar150 & auVar162;
                            iVar246 = movmskps(iVar246,auVar151);
                            if (iVar246 != 0) {
                              local_1758 = CONCAT44(fVar132,fVar124);
                              uStack_1750 = CONCAT44(fVar137,fVar135);
                              uStack_1740 = auVar116._8_8_;
                              uStack_1760 = uStack_1740;
                              local_1778 = local_1bd8;
                              uStack_1770 = uStack_1bd0;
                              local_17b8 = auVar82;
                              local_17a8 = auVar60;
                              local_1798 = auVar206;
                              local_1788 = fVar158;
                              fStack_1784 = fVar139;
                              fStack_1780 = fVar146;
                              fStack_177c = fVar147;
                              local_1768 = auVar116._0_8_;
                            }
                          }
                          auVar190._4_4_ = fVar208;
                          auVar190._0_4_ = fVar203;
                          auVar190._8_4_ = fVar211;
                          auVar190._12_4_ = fVar214;
                          auVar143._4_4_ = fVar239;
                          auVar143._0_4_ = fVar237;
                          auVar143._8_4_ = fVar242;
                          auVar143._12_4_ = fVar244;
                          fVar158 = *(float *)(pGVar37 + lVar34 + 0x30 + (long)pIVar57);
                          fVar139 = *(float *)(pGVar37 + lVar53 + lVar2 + uVar42 + 0x30 +
                                              (long)pIVar57);
                          fVar146 = *(float *)(pGVar37 + lVar53 + lVar1 + uVar42 + 0x30 +
                                              (long)pIVar57);
                          fVar147 = *(float *)(pGVar37 + lVar32 + 0x30 + (long)pIVar57);
                          fVar164 = *(float *)(pGVar37 + lVar31 + 0x30 + (long)pIVar57);
                          fVar166 = *(float *)(pGVar37 + lVar30 + 0x30 + (long)pIVar57);
                          uVar39 = *(uint *)(pre.super_Precalculations.grid + 0x18);
                          pRVar6 = (context->scene->geometries).items;
                          pGVar7 = pRVar6[uVar39].ptr;
                          uVar185 = pGVar7->mask;
                          auVar85._0_4_ = -(uint)((uVar185 & *(uint *)(ray + 0x90)) == 0);
                          auVar85._4_4_ = -(uint)((uVar185 & *(uint *)(ray + 0x94)) == 0);
                          auVar85._8_4_ = -(uint)((uVar185 & *(uint *)(ray + 0x98)) == 0);
                          auVar85._12_4_ = -(uint)((uVar185 & *(uint *)(ray + 0x9c)) == 0);
                          auVar86 = ~auVar85 & auVar151;
                          iVar246 = movmskps((int)pRVar6,auVar86);
                          pRVar48 = (RTCIntersectArguments *)pre.super_Precalculations.grid;
                          if (iVar246 != 0) {
                            uVar193 = *(uint *)(pre.super_Precalculations.grid + 0x1c);
                            pRVar48 = (RTCIntersectArguments *)(ulong)uVar193;
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar22._8_8_ = uStack_1770;
                              auVar22._0_8_ = local_1778;
                              fVar109 = (float)((ulong)local_1778 >> 0x20);
                              fVar241 = (float)((ulong)uStack_1770 >> 0x20);
                              auVar67 = rcpps(ZEXT416(uVar185),auVar22);
                              fVar168 = auVar67._0_4_;
                              fVar96 = auVar67._4_4_;
                              fVar108 = auVar67._8_4_;
                              fVar216 = auVar67._12_4_;
                              fVar168 = (float)(-(uint)(1e-18 <= ABS((float)local_1778)) &
                                               (uint)(((float)DAT_01f7ba10 -
                                                      (float)local_1778 * fVar168) * fVar168 +
                                                     fVar168));
                              fVar96 = (float)(-(uint)(1e-18 <= ABS(fVar109)) &
                                              (uint)((DAT_01f7ba10._4_4_ - fVar109 * fVar96) *
                                                     fVar96 + fVar96));
                              fVar108 = (float)(-(uint)(1e-18 <= ABS((float)uStack_1770)) &
                                               (uint)((DAT_01f7ba10._8_4_ -
                                                      (float)uStack_1770 * fVar108) * fVar108 +
                                                     fVar108));
                              fVar216 = (float)(-(uint)(1e-18 <= ABS(fVar241)) &
                                               (uint)((DAT_01f7ba10._12_4_ - fVar241 * fVar216) *
                                                      fVar216 + fVar216));
                              auVar75._0_4_ = (float)local_1758 * fVar168;
                              auVar75._4_4_ = local_1758._4_4_ * fVar96;
                              auVar75._8_4_ = (float)uStack_1750 * fVar108;
                              auVar75._12_4_ = uStack_1750._4_4_ * fVar216;
                              auVar67 = minps(auVar75,_DAT_01f7ba10);
                              auVar100._0_4_ = fVar168 * (float)local_1768;
                              auVar100._4_4_ = fVar96 * local_1768._4_4_;
                              auVar100._8_4_ = fVar108 * (float)uStack_1760;
                              auVar100._12_4_ = fVar216 * uStack_1760._4_4_;
                              auVar60 = minps(auVar100,_DAT_01f7ba10);
                              uVar185 = *(uint *)(pGVar37 + lVar29 + 0x2c + (long)pIVar57);
                              auVar118._4_4_ = uVar185;
                              auVar118._0_4_ = uVar185;
                              auVar118._8_4_ = uVar185;
                              auVar118._12_4_ = uVar185;
                              auVar82 = pblendw(auVar118,(undefined1  [16])0x0,0xaa);
                              fVar177 = (float)DAT_01fab990;
                              fVar179 = DAT_01fab990._4_4_;
                              fVar181 = DAT_01fab990._8_4_;
                              fVar110 = DAT_01fab990._12_4_;
                              uVar196 = *(uint *)(pGVar37 + lVar28 + 0x2c + (long)pIVar57);
                              auVar142._4_4_ = uVar196;
                              auVar142._0_4_ = uVar196;
                              auVar142._8_4_ = uVar196;
                              auVar142._12_4_ = uVar196;
                              fVar168 = auVar67._0_4_;
                              fVar96 = auVar67._4_4_;
                              fVar108 = auVar67._8_4_;
                              fVar216 = auVar67._12_4_;
                              fVar109 = auVar60._0_4_;
                              fVar79 = ((float)DAT_01f7ba10 - fVar168) - fVar109;
                              fVar241 = auVar60._4_4_;
                              fVar131 = (DAT_01f7ba10._4_4_ - fVar96) - fVar241;
                              fVar59 = auVar60._8_4_;
                              fVar134 = (DAT_01f7ba10._8_4_ - fVar108) - fVar59;
                              fVar78 = auVar60._12_4_;
                              fVar144 = (DAT_01f7ba10._12_4_ - fVar216) - fVar78;
                              auVar60 = pblendw(auVar142,(undefined1  [16])0x0,0xaa);
                              uVar200 = *(uint *)(pGVar37 + lVar29 + 0x30 + (long)pIVar57);
                              auVar101._4_4_ = uVar200;
                              auVar101._0_4_ = uVar200;
                              auVar101._8_4_ = uVar200;
                              auVar101._12_4_ = uVar200;
                              auVar67 = pblendw(auVar101,(undefined1  [16])0x0,0xaa);
                              local_19d8 = local_1798._0_8_;
                              uStack_19d0 = local_1798._8_8_;
                              local_19c8 = local_17a8._0_8_;
                              uStack_19c0 = local_17a8._8_8_;
                              local_19b8 = local_17b8._0_8_;
                              uStack_19b0 = local_17b8._8_8_;
                              local_19a8 = (float)auVar67._0_4_ * fVar177 * fVar168 +
                                           (float)auVar60._0_4_ * fVar177 * fVar109 +
                                           (float)auVar82._0_4_ * fVar177 * fVar79;
                              fStack_19a4 = (float)auVar67._4_4_ * fVar179 * fVar96 +
                                            (float)auVar60._4_4_ * fVar179 * fVar241 +
                                            (float)auVar82._4_4_ * fVar179 * fVar131;
                              fStack_19a0 = (float)auVar67._8_4_ * fVar181 * fVar108 +
                                            (float)auVar60._8_4_ * fVar181 * fVar59 +
                                            (float)auVar82._8_4_ * fVar181 * fVar134;
                              fStack_199c = (float)auVar67._12_4_ * fVar110 * fVar216 +
                                            (float)auVar60._12_4_ * fVar110 * fVar78 +
                                            (float)auVar82._12_4_ * fVar110 * fVar144;
                              local_1998._4_4_ =
                                   (float)(uVar200 >> 0x10) * fVar179 * fVar96 +
                                   (float)(uVar196 >> 0x10) * fVar179 * fVar241 +
                                   fVar131 * (float)(uVar185 >> 0x10) * fVar179;
                              local_1998._0_4_ =
                                   (float)(uVar200 >> 0x10) * fVar177 * fVar168 +
                                   (float)(uVar196 >> 0x10) * fVar177 * fVar109 +
                                   fVar79 * (float)(uVar185 >> 0x10) * fVar177;
                              fStack_1990 = (float)(uVar200 >> 0x10) * fVar181 * fVar108 +
                                            (float)(uVar196 >> 0x10) * fVar181 * fVar59 +
                                            fVar134 * (float)(uVar185 >> 0x10) * fVar181;
                              fStack_198c = (float)(uVar200 >> 0x10) * fVar110 * fVar216 +
                                            (float)(uVar196 >> 0x10) * fVar110 * fVar78 +
                                            fVar144 * (float)(uVar185 >> 0x10) * fVar110;
                              local_1988 = uVar193;
                              uStack_1984 = uVar193;
                              uStack_1980 = uVar193;
                              uStack_197c = uVar193;
                              local_1978 = uVar39;
                              uStack_1974 = uVar39;
                              uStack_1970 = uVar39;
                              uStack_196c = uVar39;
                              local_1968 = context->user->instID[0];
                              uStack_1964 = local_1968;
                              uStack_1960 = local_1968;
                              uStack_195c = local_1968;
                              local_1958 = context->user->instPrimID[0];
                              uStack_1954 = local_1958;
                              uStack_1950 = local_1958;
                              uStack_194c = local_1958;
                              _local_1b48 = *(undefined1 (*) [16])(ray + 0x80);
                              auVar21._4_4_ = fStack_1784;
                              auVar21._0_4_ = local_1788;
                              auVar21._8_4_ = fStack_1780;
                              auVar21._12_4_ = fStack_177c;
                              auVar67 = blendvps(_local_1b48,auVar21,auVar86);
                              *(undefined1 (*) [16])(ray + 0x80) = auVar67;
                              args.valid = (int *)local_1b68;
                              args.geometryUserPtr = pGVar7->userPtr;
                              args.context = context->user;
                              args.hit = (RTCHitN *)&local_19d8;
                              args.N = 4;
                              pRVar44 = (RTCRayN *)pGVar7->occlusionFilterN;
                              local_1b68 = auVar86;
                              _local_1b38 = ZEXT416((uint)fVar166);
                              args.ray = (RTCRayN *)ray;
                              if (pRVar44 != (RTCRayN *)0x0) {
                                pRVar44 = (RTCRayN *)(*(code *)pRVar44)(&args);
                              }
                              fVar166 = local_1b38._0_4_;
                              if (local_1b68 == (undefined1  [16])0x0) {
                                auVar104._8_4_ = 0xffffffff;
                                auVar104._0_8_ = 0xffffffffffffffff;
                                auVar104._12_4_ = 0xffffffff;
                                auVar104 = auVar104 ^ _DAT_01f7ae20;
                              }
                              else {
                                pRVar48 = context->args;
                                if (pRVar48->filter == (RTCFilterFunctionN)0x0) {
                                }
                                else if (((pRVar48->flags &
                                          RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                          RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                                  (*pRVar48->filter)(&args);
                                }
                                fVar166 = local_1b38._0_4_;
                                auVar91._0_4_ = -(uint)(local_1b68._0_4_ == 0);
                                auVar91._4_4_ = -(uint)(local_1b68._4_4_ == 0);
                                auVar91._8_4_ = -(uint)(local_1b68._8_4_ == 0);
                                auVar91._12_4_ = -(uint)(local_1b68._12_4_ == 0);
                                auVar104 = auVar91 ^ _DAT_01f7ae20;
                                auVar67 = blendvps(_DAT_01f7aa00,
                                                   *(undefined1 (*) [16])(args.ray + 0x80),auVar91);
                                *(undefined1 (*) [16])(args.ray + 0x80) = auVar67;
                                pRVar44 = args.ray;
                              }
                              uVar39 = (uint)pRVar44;
                              auVar105._0_4_ = auVar104._0_4_ << 0x1f;
                              auVar105._4_4_ = auVar104._4_4_ << 0x1f;
                              auVar105._8_4_ = auVar104._8_4_ << 0x1f;
                              auVar105._12_4_ = auVar104._12_4_ << 0x1f;
                              auVar86._0_4_ = auVar105._0_4_ >> 0x1f;
                              auVar86._4_4_ = auVar105._4_4_ >> 0x1f;
                              auVar86._8_4_ = auVar105._8_4_ >> 0x1f;
                              auVar86._12_4_ = auVar105._12_4_ >> 0x1f;
                              auVar67 = blendvps(_local_1b48,*(undefined1 (*) [16])(ray + 0x80),
                                                 auVar105);
                              *(undefined1 (*) [16])(ray + 0x80) = auVar67;
                            }
                            auVar113 = ~auVar86 & auVar113;
                          }
                          iVar246 = movmskps(uVar39,auVar113);
                          if (iVar246 == 0) {
                            iVar246 = 0x7f800000;
                            iVar250 = 0x7f800000;
                            iVar254 = 0x7f800000;
                            iVar258 = 0x7f800000;
                            break;
                          }
                          fVar168 = *(float *)ray;
                          fVar96 = *(float *)(ray + 4);
                          fVar108 = *(float *)(ray + 8);
                          fVar216 = *(float *)(ray + 0xc);
                          fVar109 = *(float *)(ray + 0x10);
                          fVar241 = *(float *)(ray + 0x14);
                          fVar59 = *(float *)(ray + 0x18);
                          fVar78 = *(float *)(ray + 0x1c);
                          fVar79 = *(float *)(ray + 0x20);
                          fVar131 = *(float *)(ray + 0x24);
                          fVar134 = *(float *)(ray + 0x28);
                          fVar144 = *(float *)(ray + 0x2c);
                          fVar177 = *(float *)(ray + 0x40);
                          fVar179 = *(float *)(ray + 0x44);
                          fVar181 = *(float *)(ray + 0x48);
                          fVar110 = *(float *)(ray + 0x4c);
                          fVar186 = fVar186 - fVar168;
                          fVar194 = fVar194 - fVar96;
                          fVar197 = fVar197 - fVar108;
                          fVar201 = fVar201 - fVar216;
                          fVar204 = auVar190._0_4_ - fVar109;
                          fVar211 = auVar190._4_4_ - fVar241;
                          fVar215 = auVar190._8_4_ - fVar59;
                          fVar219 = auVar190._12_4_ - fVar78;
                          fVar121 = auVar143._0_4_ - fVar79;
                          fVar123 = auVar143._4_4_ - fVar131;
                          fVar125 = auVar143._8_4_ - fVar134;
                          fVar133 = auVar143._12_4_ - fVar144;
                          fVar148 = fVar148 - fVar168;
                          fVar154 = fVar154 - fVar96;
                          fVar156 = fVar156 - fVar108;
                          fVar157 = fVar157 - fVar216;
                          fVar145 = fVar145 - fVar109;
                          fVar153 = fVar153 - fVar241;
                          fVar155 = fVar155 - fVar59;
                          fVar171 = fVar171 - fVar78;
                          fVar247 = fVar247 - fVar79;
                          fVar251 = fVar251 - fVar131;
                          fVar255 = fVar255 - fVar134;
                          fVar259 = fVar259 - fVar144;
                          fVar168 = (fVar158 * fVar183 + fVar147 * fVar80) - fVar168;
                          fVar96 = (fVar158 * fVar191 + fVar147 * fVar184) - fVar96;
                          fVar108 = (fVar158 * fVar195 + fVar147 * fVar192) - fVar108;
                          fVar216 = (fVar158 * fVar198 + fVar147 * fVar199) - fVar216;
                          fVar109 = (fVar139 * fVar183 + fVar164 * fVar80) - fVar109;
                          fVar241 = (fVar139 * fVar191 + fVar164 * fVar184) - fVar241;
                          fVar59 = (fVar139 * fVar195 + fVar164 * fVar192) - fVar59;
                          fVar78 = (fVar139 * fVar198 + fVar164 * fVar199) - fVar78;
                          fVar79 = (fVar146 * fVar183 + fVar166 * fVar80) - fVar79;
                          fVar131 = (fVar146 * fVar191 + fVar166 * fVar184) - fVar131;
                          fVar134 = (fVar146 * fVar195 + fVar166 * fVar192) - fVar134;
                          fVar144 = (fVar146 * fVar198 + fVar166 * fVar199) - fVar144;
                          fVar136 = fVar168 - fVar186;
                          fVar138 = fVar96 - fVar194;
                          fVar165 = fVar108 - fVar197;
                          fVar169 = fVar216 - fVar201;
                          fVar222 = fVar109 - fVar204;
                          fVar224 = fVar241 - fVar211;
                          fVar226 = fVar59 - fVar215;
                          fVar228 = fVar78 - fVar219;
                          fVar208 = fVar79 - fVar121;
                          fVar212 = fVar131 - fVar123;
                          fVar217 = fVar134 - fVar125;
                          fVar220 = fVar144 - fVar133;
                          auVar23 = *(undefined1 (*) [12])(ray + 0x60);
                          fVar158 = *(float *)(ray + 0x6c);
                          fVar137 = fVar186 - fVar148;
                          fVar159 = fVar194 - fVar154;
                          fVar167 = fVar197 - fVar156;
                          fVar172 = fVar201 - fVar157;
                          local_1c18 = (float)*(undefined8 *)(ray + 0x50);
                          fStack_1c14 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
                          fStack_1c10 = (float)*(undefined8 *)(ray + 0x58);
                          fStack_1c0c = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
                          fVar209 = fVar204 - fVar145;
                          fVar214 = fVar211 - fVar153;
                          fVar218 = fVar215 - fVar155;
                          fVar221 = fVar219 - fVar171;
                          fVar147 = (fVar222 * (fVar79 + fVar121) - (fVar109 + fVar204) * fVar208) *
                                    fVar177 + ((fVar168 + fVar186) * fVar208 -
                                              (fVar79 + fVar121) * fVar136) * local_1c18 +
                                              (fVar136 * (fVar109 + fVar204) -
                                              (fVar168 + fVar186) * fVar222) *
                                              *(float *)(ray + 0x60);
                          fVar164 = (fVar224 * (fVar131 + fVar123) - (fVar241 + fVar211) * fVar212)
                                    * fVar179 +
                                    ((fVar96 + fVar194) * fVar212 - (fVar131 + fVar123) * fVar138) *
                                    fStack_1c14 +
                                    (fVar138 * (fVar241 + fVar211) - (fVar96 + fVar194) * fVar224) *
                                    *(float *)(ray + 100);
                          uStack_1c40._0_4_ =
                               (fVar226 * (fVar134 + fVar125) - (fVar59 + fVar215) * fVar217) *
                               fVar181 + ((fVar108 + fVar197) * fVar217 -
                                         (fVar134 + fVar125) * fVar165) * fStack_1c10 +
                                         (fVar165 * (fVar59 + fVar215) -
                                         (fVar108 + fVar197) * fVar226) * *(float *)(ray + 0x68);
                          uStack_1c40._4_4_ =
                               (fVar228 * (fVar144 + fVar133) - (fVar78 + fVar219) * fVar220) *
                               fVar110 + ((fVar216 + fVar201) * fVar220 -
                                         (fVar144 + fVar133) * fVar169) * fStack_1c0c +
                                         (fVar169 * (fVar78 + fVar219) -
                                         (fVar216 + fVar201) * fVar228) * fVar158;
                          fVar223 = fVar121 - fVar247;
                          fVar225 = fVar123 - fVar251;
                          fVar227 = fVar125 - fVar255;
                          fVar229 = fVar133 - fVar259;
                          local_1b88 = auVar23._0_4_;
                          fStack_1b84 = auVar23._4_4_;
                          fStack_1b80 = auVar23._8_4_;
                          fVar139 = (fVar209 * (fVar121 + fVar247) - (fVar204 + fVar145) * fVar223)
                                    * fVar177 +
                                    ((fVar186 + fVar148) * fVar223 - (fVar121 + fVar247) * fVar137)
                                    * local_1c18 +
                                    (fVar137 * (fVar204 + fVar145) - (fVar186 + fVar148) * fVar209)
                                    * local_1b88;
                          fVar146 = (fVar214 * (fVar123 + fVar251) - (fVar211 + fVar153) * fVar225)
                                    * fVar179 +
                                    ((fVar194 + fVar154) * fVar225 - (fVar123 + fVar251) * fVar159)
                                    * fStack_1c14 +
                                    (fVar159 * (fVar211 + fVar153) - (fVar194 + fVar154) * fVar214)
                                    * fStack_1b84;
                          auVar163._0_8_ = CONCAT44(fVar146,fVar139);
                          auVar163._8_4_ =
                               (fVar218 * (fVar125 + fVar255) - (fVar215 + fVar155) * fVar227) *
                               fVar181 + ((fVar197 + fVar156) * fVar227 -
                                         (fVar125 + fVar255) * fVar167) * fStack_1c10 +
                                         (fVar167 * (fVar215 + fVar155) -
                                         (fVar197 + fVar156) * fVar218) * fStack_1b80;
                          auVar163._12_4_ =
                               (fVar221 * (fVar133 + fVar259) - (fVar219 + fVar171) * fVar229) *
                               fVar110 + ((fVar201 + fVar157) * fVar229 -
                                         (fVar133 + fVar259) * fVar172) * fStack_1c0c +
                                         (fVar172 * (fVar219 + fVar171) -
                                         (fVar201 + fVar157) * fVar221) * fVar158;
                          fVar178 = fVar148 - fVar168;
                          fVar180 = fVar154 - fVar96;
                          fVar182 = fVar156 - fVar108;
                          fVar203 = fVar157 - fVar216;
                          fVar122 = fVar145 - fVar109;
                          fVar124 = fVar153 - fVar241;
                          auVar16._4_4_ = fVar124;
                          auVar16._0_4_ = fVar122;
                          fVar132 = fVar155 - fVar59;
                          fVar135 = fVar171 - fVar78;
                          fVar166 = fVar247 - fVar79;
                          fVar111 = fVar251 - fVar131;
                          fVar112 = fVar255 - fVar134;
                          fVar120 = fVar259 - fVar144;
                          auVar71._0_4_ =
                               (fVar122 * (fVar79 + fVar247) - (fVar109 + fVar145) * fVar166) *
                               fVar177 + ((fVar168 + fVar148) * fVar166 -
                                         (fVar79 + fVar247) * fVar178) * local_1c18 +
                                         (fVar178 * (fVar109 + fVar145) -
                                         (fVar168 + fVar148) * fVar122) * local_1b88;
                          auVar71._4_4_ =
                               (fVar124 * (fVar131 + fVar251) - (fVar241 + fVar153) * fVar111) *
                               fVar179 + ((fVar96 + fVar154) * fVar111 -
                                         (fVar131 + fVar251) * fVar180) * fStack_1c14 +
                                         (fVar180 * (fVar241 + fVar153) -
                                         (fVar96 + fVar154) * fVar124) * fStack_1b84;
                          auVar71._8_4_ =
                               (fVar132 * (fVar134 + fVar255) - (fVar59 + fVar155) * fVar112) *
                               fVar181 + ((fVar108 + fVar156) * fVar112 -
                                         (fVar134 + fVar255) * fVar182) * fStack_1c10 +
                                         (fVar182 * (fVar59 + fVar155) -
                                         (fVar108 + fVar156) * fVar132) * fStack_1b80;
                          auVar71._12_4_ =
                               (fVar135 * (fVar144 + fVar259) - (fVar78 + fVar171) * fVar120) *
                               fVar110 + ((fVar216 + fVar157) * fVar120 -
                                         (fVar144 + fVar259) * fVar203) * fStack_1c0c +
                                         (fVar203 * (fVar78 + fVar171) -
                                         (fVar216 + fVar157) * fVar135) * fVar158;
                          fVar139 = fVar147 + fVar139 + auVar71._0_4_;
                          fVar146 = fVar164 + fVar146 + auVar71._4_4_;
                          auVar99._0_8_ = CONCAT44(fVar146,fVar139);
                          auVar99._8_4_ = (float)uStack_1c40 + auVar163._8_4_ + auVar71._8_4_;
                          auVar99._12_4_ = uStack_1c40._4_4_ + auVar163._12_4_ + auVar71._12_4_;
                          auVar87._4_4_ = fVar164;
                          auVar87._0_4_ = fVar147;
                          auVar87._8_4_ = (float)uStack_1c40;
                          auVar87._12_4_ = uStack_1c40._4_4_;
                          auVar67 = minps(auVar87,auVar163);
                          auVar67 = minps(auVar67,auVar71);
                          local_1c48 = CONCAT44(fVar164,fVar147);
                          auVar127._4_4_ = fVar164;
                          auVar127._0_4_ = fVar147;
                          auVar127._8_4_ = (float)uStack_1c40;
                          auVar127._12_4_ = uStack_1c40._4_4_;
                          auVar60 = maxps(auVar127,auVar163);
                          auVar60 = maxps(auVar60,auVar71);
                          fVar139 = (float)((uint)fVar139 & (uint)DAT_01f7b6c0) * 1.1920929e-07;
                          fVar146 = (float)((uint)fVar146 & DAT_01f7b6c0._4_4_) * 1.1920929e-07;
                          fVar147 = (float)((uint)auVar99._8_4_ & DAT_01f7b6c0._8_4_) *
                                    1.1920929e-07;
                          fVar164 = (float)((uint)auVar99._12_4_ & DAT_01f7b6c0._12_4_) *
                                    1.1920929e-07;
                          local_1c78 = auVar113._0_4_;
                          uStack_1c74 = auVar113._4_4_;
                          uStack_1c70 = auVar113._8_4_;
                          uStack_1c6c = auVar113._12_4_;
                          auVar128._0_8_ =
                               CONCAT44(-(uint)(auVar60._4_4_ <= fVar146 ||
                                               -fVar146 <= auVar67._4_4_) & uStack_1c74,
                                        -(uint)(auVar60._0_4_ <= fVar139 ||
                                               -fVar139 <= auVar67._0_4_) & local_1c78);
                          auVar128._8_4_ =
                               -(uint)(auVar60._8_4_ <= fVar147 || -fVar147 <= auVar67._8_4_) &
                               uStack_1c70;
                          auVar128._12_4_ =
                               -(uint)(auVar60._12_4_ <= fVar164 || -fVar164 <= auVar67._12_4_) &
                               uStack_1c6c;
                          iVar246 = movmskps(iVar246,auVar128);
                          if (iVar246 == 0) {
                            auVar236._8_4_ = auVar128._8_4_;
                            auVar236._0_8_ = auVar128._0_8_;
                            auVar236._12_4_ = auVar128._12_4_;
                          }
                          else {
                            auVar16._8_4_ = fVar132;
                            auVar16._12_4_ = fVar135;
                            auVar117._0_4_ = fVar222 * fVar223 - fVar209 * fVar208;
                            auVar117._4_4_ = fVar224 * fVar225 - fVar214 * fVar212;
                            auVar117._8_4_ = fVar226 * fVar227 - fVar218 * fVar217;
                            auVar117._12_4_ = fVar228 * fVar229 - fVar221 * fVar220;
                            auVar189._0_4_ = fVar209 * fVar166 - fVar122 * fVar223;
                            auVar189._4_4_ = fVar214 * fVar111 - fVar124 * fVar225;
                            auVar189._8_4_ = fVar218 * fVar112 - fVar132 * fVar227;
                            auVar189._12_4_ = fVar221 * fVar120 - fVar135 * fVar229;
                            auVar72._4_4_ = -(uint)(ABS(fVar214 * fVar212) < ABS(fVar124 * fVar225))
                            ;
                            auVar72._0_4_ = -(uint)(ABS(fVar209 * fVar208) < ABS(fVar122 * fVar223))
                            ;
                            auVar72._8_4_ = -(uint)(ABS(fVar218 * fVar217) < ABS(fVar132 * fVar227))
                            ;
                            auVar72._12_4_ =
                                 -(uint)(ABS(fVar221 * fVar220) < ABS(fVar135 * fVar229));
                            auVar206 = blendvps(auVar189,auVar117,auVar72);
                            auVar175._0_4_ = fVar178 * fVar223 - fVar137 * fVar166;
                            auVar175._4_4_ = fVar180 * fVar225 - fVar159 * fVar111;
                            auVar175._8_4_ = fVar182 * fVar227 - fVar167 * fVar112;
                            auVar175._12_4_ = fVar203 * fVar229 - fVar172 * fVar120;
                            auVar73._4_4_ = -(uint)(ABS(fVar138 * fVar225) < ABS(fVar159 * fVar111))
                            ;
                            auVar73._0_4_ = -(uint)(ABS(fVar136 * fVar223) < ABS(fVar137 * fVar166))
                            ;
                            auVar73._8_4_ = -(uint)(ABS(fVar165 * fVar227) < ABS(fVar167 * fVar112))
                            ;
                            auVar73._12_4_ =
                                 -(uint)(ABS(fVar169 * fVar229) < ABS(fVar172 * fVar120));
                            auVar13._4_4_ = fVar212 * fVar159 - fVar138 * fVar225;
                            auVar13._0_4_ = fVar208 * fVar137 - fVar136 * fVar223;
                            auVar13._8_4_ = fVar217 * fVar167 - fVar165 * fVar227;
                            auVar13._12_4_ = fVar220 * fVar172 - fVar169 * fVar229;
                            auVar82 = blendvps(auVar175,auVar13,auVar73);
                            auVar152._0_4_ = fVar137 * fVar122 - fVar178 * fVar209;
                            auVar152._4_4_ = fVar159 * fVar124 - fVar180 * fVar214;
                            auVar152._8_4_ = fVar167 * fVar132 - fVar182 * fVar218;
                            auVar152._12_4_ = fVar172 * fVar135 - fVar203 * fVar221;
                            auVar74._4_4_ = -(uint)(ABS(fVar159 * fVar224) < ABS(fVar180 * fVar214))
                            ;
                            auVar74._0_4_ = -(uint)(ABS(fVar137 * fVar222) < ABS(fVar178 * fVar209))
                            ;
                            auVar74._8_4_ = -(uint)(ABS(fVar167 * fVar226) < ABS(fVar182 * fVar218))
                            ;
                            auVar74._12_4_ =
                                 -(uint)(ABS(fVar172 * fVar228) < ABS(fVar203 * fVar221));
                            auVar17._4_4_ = fVar138 * fVar214 - fVar159 * fVar224;
                            auVar17._0_4_ = fVar136 * fVar209 - fVar137 * fVar222;
                            auVar17._8_4_ = fVar165 * fVar218 - fVar167 * fVar226;
                            auVar17._12_4_ = fVar169 * fVar221 - fVar172 * fVar228;
                            auVar60 = blendvps(auVar152,auVar17,auVar74);
                            fVar139 = fVar177 * auVar206._0_4_ +
                                      local_1c18 * auVar82._0_4_ + local_1b88 * auVar60._0_4_;
                            fVar146 = fVar179 * auVar206._4_4_ +
                                      fStack_1c14 * auVar82._4_4_ + fStack_1b84 * auVar60._4_4_;
                            fVar147 = fVar181 * auVar206._8_4_ +
                                      fStack_1c10 * auVar82._8_4_ + fStack_1b80 * auVar60._8_4_;
                            fVar158 = fVar110 * auVar206._12_4_ +
                                      fStack_1c0c * auVar82._12_4_ + fVar158 * auVar60._12_4_;
                            auVar234._0_4_ = fVar139 + fVar139;
                            auVar234._4_4_ = fVar146 + fVar146;
                            auVar234._8_4_ = fVar147 + fVar147;
                            auVar234._12_4_ = fVar158 + fVar158;
                            auVar88._0_4_ = fVar121 * auVar60._0_4_;
                            auVar88._4_4_ = fVar123 * auVar60._4_4_;
                            auVar88._8_4_ = fVar125 * auVar60._8_4_;
                            auVar88._12_4_ = fVar133 * auVar60._12_4_;
                            fVar164 = fVar186 * auVar206._0_4_ +
                                      fVar204 * auVar82._0_4_ + auVar88._0_4_;
                            fVar166 = fVar194 * auVar206._4_4_ +
                                      fVar211 * auVar82._4_4_ + auVar88._4_4_;
                            fVar168 = fVar197 * auVar206._8_4_ +
                                      fVar215 * auVar82._8_4_ + auVar88._8_4_;
                            fVar96 = fVar201 * auVar206._12_4_ +
                                     fVar219 * auVar82._12_4_ + auVar88._12_4_;
                            auVar67 = rcpps(auVar88,auVar234);
                            fVar158 = auVar67._0_4_;
                            fVar139 = auVar67._4_4_;
                            fVar146 = auVar67._8_4_;
                            fVar147 = auVar67._12_4_;
                            fVar158 = ((1.0 - auVar234._0_4_ * fVar158) * fVar158 + fVar158) *
                                      (fVar164 + fVar164);
                            fVar139 = ((1.0 - auVar234._4_4_ * fVar139) * fVar139 + fVar139) *
                                      (fVar166 + fVar166);
                            fVar146 = ((1.0 - auVar234._8_4_ * fVar146) * fVar146 + fVar146) *
                                      (fVar168 + fVar168);
                            fVar147 = ((1.0 - auVar234._12_4_ * fVar147) * fVar147 + fVar147) *
                                      (fVar96 + fVar96);
                            auVar235._0_4_ =
                                 (int)((uint)(auVar234._0_4_ != 0.0 &&
                                             (fVar158 <= *(float *)(ray + 0x80) &&
                                             *(float *)(ray + 0x30) <= fVar158)) * -0x80000000) >>
                                 0x1f;
                            auVar235._4_4_ =
                                 (int)((uint)(auVar234._4_4_ != 0.0 &&
                                             (fVar139 <= *(float *)(ray + 0x84) &&
                                             *(float *)(ray + 0x34) <= fVar139)) * -0x80000000) >>
                                 0x1f;
                            auVar235._8_4_ =
                                 (int)((uint)(auVar234._8_4_ != 0.0 &&
                                             (fVar146 <= *(float *)(ray + 0x88) &&
                                             *(float *)(ray + 0x38) <= fVar146)) * -0x80000000) >>
                                 0x1f;
                            auVar235._12_4_ =
                                 (int)((uint)(auVar234._12_4_ != 0.0 &&
                                             (fVar147 <= *(float *)(ray + 0x8c) &&
                                             *(float *)(ray + 0x3c) <= fVar147)) * -0x80000000) >>
                                 0x1f;
                            auVar236 = auVar235 & auVar128;
                            iVar246 = movmskps(iVar246,auVar236);
                            _local_1b48 = auVar163;
                            _local_1b38 = auVar16;
                            if (iVar246 != 0) {
                              local_17c8 = local_1c48;
                              uStack_17c0 = uStack_1c40;
                              uStack_1b40 = auVar163._8_8_;
                              uStack_17d0 = uStack_1b40;
                              uStack_1b00 = auVar99._8_8_;
                              uStack_17e0 = uStack_1b00;
                              local_1828 = auVar60;
                              local_1818 = auVar82;
                              local_1808 = auVar206;
                              local_17f8 = fVar158;
                              fStack_17f4 = fVar139;
                              fStack_17f0 = fVar146;
                              fStack_17ec = fVar147;
                              local_17e8 = auVar99._0_8_;
                              local_17d8 = auVar163._0_8_;
                            }
                          }
                          uVar39 = *(uint *)(pre.super_Precalculations.grid + 0x18);
                          pRVar6 = (context->scene->geometries).items;
                          pGVar7 = pRVar6[uVar39].ptr;
                          uVar185 = pGVar7->mask;
                          auVar89._0_4_ = -(uint)((uVar185 & *(uint *)(ray + 0x90)) == 0);
                          auVar89._4_4_ = -(uint)((uVar185 & *(uint *)(ray + 0x94)) == 0);
                          auVar89._8_4_ = -(uint)((uVar185 & *(uint *)(ray + 0x98)) == 0);
                          auVar89._12_4_ = -(uint)((uVar185 & *(uint *)(ray + 0x9c)) == 0);
                          auVar90 = ~auVar89 & auVar236;
                          iVar246 = movmskps((int)pRVar6,auVar90);
                          pRVar48 = (RTCIntersectArguments *)pre.super_Precalculations.grid;
                          if (iVar246 != 0) {
                            uVar193 = *(uint *)(pre.super_Precalculations.grid + 0x1c);
                            pRVar48 = (RTCIntersectArguments *)(ulong)uVar193;
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar20._8_8_ = uStack_17e0;
                              auVar20._0_8_ = local_17e8;
                              fVar164 = (float)((ulong)local_17e8 >> 0x20);
                              fVar166 = (float)((ulong)uStack_17e0 >> 0x20);
                              auVar67 = rcpps(ZEXT416(uVar185),auVar20);
                              fVar158 = auVar67._0_4_;
                              fVar139 = auVar67._4_4_;
                              fVar146 = auVar67._8_4_;
                              fVar147 = auVar67._12_4_;
                              fVar158 = (float)(-(uint)(1e-18 <= ABS((float)local_17e8)) &
                                               (uint)(((float)DAT_01f7ba10 -
                                                      (float)local_17e8 * fVar158) * fVar158 +
                                                     fVar158));
                              fVar139 = (float)(-(uint)(1e-18 <= ABS(fVar164)) &
                                               (uint)((DAT_01f7ba10._4_4_ - fVar164 * fVar139) *
                                                      fVar139 + fVar139));
                              fVar146 = (float)(-(uint)(1e-18 <= ABS((float)uStack_17e0)) &
                                               (uint)((DAT_01f7ba10._8_4_ -
                                                      (float)uStack_17e0 * fVar146) * fVar146 +
                                                     fVar146));
                              fVar147 = (float)(-(uint)(1e-18 <= ABS(fVar166)) &
                                               (uint)((DAT_01f7ba10._12_4_ - fVar166 * fVar147) *
                                                      fVar147 + fVar147));
                              auVar76._0_4_ = (float)local_17c8 * fVar158;
                              auVar76._4_4_ = local_17c8._4_4_ * fVar139;
                              auVar76._8_4_ = (float)uStack_17c0 * fVar146;
                              auVar76._12_4_ = uStack_17c0._4_4_ * fVar147;
                              auVar67 = minps(auVar76,_DAT_01f7ba10);
                              auVar102._0_4_ = fVar158 * (float)local_17d8;
                              auVar102._4_4_ = fVar139 * local_17d8._4_4_;
                              auVar102._8_4_ = fVar146 * (float)uStack_17d0;
                              auVar102._12_4_ = fVar147 * uStack_17d0._4_4_;
                              auVar60 = minps(auVar102,_DAT_01f7ba10);
                              uVar185 = *(uint *)(pGVar37 + lVar28 + 0x2c + (long)pIVar57);
                              uVar196 = *(uint *)(pGVar37 + lVar28 + 0x30 + (long)pIVar57);
                              auVar129._4_4_ = uVar185;
                              auVar129._0_4_ = uVar185;
                              auVar129._8_4_ = uVar185;
                              auVar129._12_4_ = uVar185;
                              auVar82 = pblendw(auVar129,(undefined1  [16])0x0,0xaa);
                              fVar59 = (float)DAT_01fab990;
                              fVar78 = DAT_01fab990._4_4_;
                              fVar79 = DAT_01fab990._8_4_;
                              fVar131 = DAT_01fab990._12_4_;
                              auVar119._4_4_ = uVar196;
                              auVar119._0_4_ = uVar196;
                              auVar119._8_4_ = uVar196;
                              auVar119._12_4_ = uVar196;
                              fVar158 = auVar67._0_4_;
                              fVar139 = auVar67._4_4_;
                              fVar146 = auVar67._8_4_;
                              fVar147 = auVar67._12_4_;
                              fVar164 = auVar60._0_4_;
                              fVar108 = ((float)DAT_01f7ba10 - fVar158) - fVar164;
                              fVar166 = auVar60._4_4_;
                              fVar216 = (DAT_01f7ba10._4_4_ - fVar139) - fVar166;
                              fVar168 = auVar60._8_4_;
                              fVar109 = (DAT_01f7ba10._8_4_ - fVar146) - fVar168;
                              fVar96 = auVar60._12_4_;
                              fVar241 = (DAT_01f7ba10._12_4_ - fVar147) - fVar96;
                              auVar60 = pblendw(auVar119,(undefined1  [16])0x0,0xaa);
                              uVar200 = *(uint *)(pGVar37 + lVar29 + 0x30 + (long)pIVar57);
                              auVar103._4_4_ = uVar200;
                              auVar103._0_4_ = uVar200;
                              auVar103._8_4_ = uVar200;
                              auVar103._12_4_ = uVar200;
                              auVar67 = pblendw(auVar103,(undefined1  [16])0x0,0xaa);
                              local_1998._0_4_ =
                                   (float)(uVar200 >> 0x10) * fVar59 * fVar158 +
                                   (float)(uVar196 >> 0x10) * fVar59 * fVar164 +
                                   fVar108 * (float)(uVar185 >> 0x10) * fVar59;
                              local_1998._4_4_ =
                                   (float)(uVar200 >> 0x10) * fVar78 * fVar139 +
                                   (float)(uVar196 >> 0x10) * fVar78 * fVar166 +
                                   fVar216 * (float)(uVar185 >> 0x10) * fVar78;
                              fStack_1990 = (float)(uVar200 >> 0x10) * fVar79 * fVar146 +
                                            (float)(uVar196 >> 0x10) * fVar79 * fVar168 +
                                            fVar109 * (float)(uVar185 >> 0x10) * fVar79;
                              fStack_198c = (float)(uVar200 >> 0x10) * fVar131 * fVar147 +
                                            (float)(uVar196 >> 0x10) * fVar131 * fVar96 +
                                            fVar241 * (float)(uVar185 >> 0x10) * fVar131;
                              local_19d8 = local_1808._0_8_;
                              uStack_19d0 = local_1808._8_8_;
                              local_19c8 = local_1818._0_8_;
                              uStack_19c0 = local_1818._8_8_;
                              local_19b8 = local_1828._0_8_;
                              uStack_19b0 = local_1828._8_8_;
                              local_19a8 = (float)auVar67._0_4_ * fVar59 * fVar158 +
                                           (float)auVar60._0_4_ * fVar59 * fVar164 +
                                           (float)auVar82._0_4_ * fVar59 * fVar108;
                              fStack_19a4 = (float)auVar67._4_4_ * fVar78 * fVar139 +
                                            (float)auVar60._4_4_ * fVar78 * fVar166 +
                                            (float)auVar82._4_4_ * fVar78 * fVar216;
                              fStack_19a0 = (float)auVar67._8_4_ * fVar79 * fVar146 +
                                            (float)auVar60._8_4_ * fVar79 * fVar168 +
                                            (float)auVar82._8_4_ * fVar79 * fVar109;
                              fStack_199c = (float)auVar67._12_4_ * fVar131 * fVar147 +
                                            (float)auVar60._12_4_ * fVar131 * fVar96 +
                                            (float)auVar82._12_4_ * fVar131 * fVar241;
                              local_1988 = uVar193;
                              uStack_1984 = uVar193;
                              uStack_1980 = uVar193;
                              uStack_197c = uVar193;
                              local_1978 = uVar39;
                              uStack_1974 = uVar39;
                              uStack_1970 = uVar39;
                              uStack_196c = uVar39;
                              local_1968 = context->user->instID[0];
                              uStack_1964 = local_1968;
                              uStack_1960 = local_1968;
                              uStack_195c = local_1968;
                              local_1958 = context->user->instPrimID[0];
                              uStack_1954 = local_1958;
                              uStack_1950 = local_1958;
                              uStack_194c = local_1958;
                              auVar67 = *(undefined1 (*) [16])(ray + 0x80);
                              auVar19._4_4_ = fStack_17f4;
                              auVar19._0_4_ = local_17f8;
                              auVar19._8_4_ = fStack_17f0;
                              auVar19._12_4_ = fStack_17ec;
                              auVar60 = blendvps(auVar67,auVar19,auVar90);
                              *(undefined1 (*) [16])(ray + 0x80) = auVar60;
                              args.valid = (int *)local_1b68;
                              args.geometryUserPtr = pGVar7->userPtr;
                              args.context = context->user;
                              args.hit = (RTCHitN *)&local_19d8;
                              args.N = 4;
                              pRVar44 = (RTCRayN *)pGVar7->occlusionFilterN;
                              local_1b68 = auVar90;
                              args.ray = (RTCRayN *)ray;
                              if (pRVar44 != (RTCRayN *)0x0) {
                                pRVar44 = (RTCRayN *)(*(code *)pRVar44)(&args);
                              }
                              if (local_1b68 == (undefined1  [16])0x0) {
                                auVar106._8_4_ = 0xffffffff;
                                auVar106._0_8_ = 0xffffffffffffffff;
                                auVar106._12_4_ = 0xffffffff;
                                auVar106 = auVar106 ^ _DAT_01f7ae20;
                              }
                              else {
                                pRVar48 = context->args;
                                if ((pRVar48->filter != (RTCFilterFunctionN)0x0) &&
                                   (((pRVar48->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*pRVar48->filter)(&args);
                                }
                                auVar92._0_4_ = -(uint)(local_1b68._0_4_ == 0);
                                auVar92._4_4_ = -(uint)(local_1b68._4_4_ == 0);
                                auVar92._8_4_ = -(uint)(local_1b68._8_4_ == 0);
                                auVar92._12_4_ = -(uint)(local_1b68._12_4_ == 0);
                                auVar106 = auVar92 ^ _DAT_01f7ae20;
                                auVar60 = blendvps(_DAT_01f7aa00,
                                                   *(undefined1 (*) [16])(args.ray + 0x80),auVar92);
                                *(undefined1 (*) [16])(args.ray + 0x80) = auVar60;
                                pRVar44 = args.ray;
                              }
                              uVar39 = (uint)pRVar44;
                              auVar107._0_4_ = auVar106._0_4_ << 0x1f;
                              auVar107._4_4_ = auVar106._4_4_ << 0x1f;
                              auVar107._8_4_ = auVar106._8_4_ << 0x1f;
                              auVar107._12_4_ = auVar106._12_4_ << 0x1f;
                              auVar90._0_4_ = auVar107._0_4_ >> 0x1f;
                              auVar90._4_4_ = auVar107._4_4_ >> 0x1f;
                              auVar90._8_4_ = auVar107._8_4_ >> 0x1f;
                              auVar90._12_4_ = auVar107._12_4_ >> 0x1f;
                              auVar67 = blendvps(auVar67,*(undefined1 (*) [16])(ray + 0x80),auVar107
                                                );
                              *(undefined1 (*) [16])(ray + 0x80) = auVar67;
                            }
                            auVar113 = ~auVar90 & auVar113;
                          }
                          iVar258 = 0x7f800000;
                          iVar254 = 0x7f800000;
                          iVar250 = 0x7f800000;
                          iVar246 = 0x7f800000;
                          iVar40 = movmskps(uVar39,auVar113);
                          pIVar57 = (Intersectors *)((long)&pIVar57->ptr + 4);
                        } while (iVar40 != 0);
                        lVar55 = 1;
                        uVar45 = 0;
                      } while (((byte)local_1b4c & local_1b50 != 2) != 0);
                      local_1838 = auVar66._0_4_;
                      uStack_1834 = auVar66._4_4_;
                      uStack_1830 = auVar66._8_4_;
                      uStack_182c = auVar66._12_4_;
                      auVar130._0_4_ = auVar126._0_4_ ^ local_1838;
                      auVar130._4_4_ = auVar126._4_4_ ^ uStack_1834;
                      auVar130._8_4_ = auVar126._8_4_ ^ uStack_1830;
                      auVar130._12_4_ = auVar126._12_4_ ^ uStack_182c;
                      auVar113 = auVar113 | auVar98;
                      local_1bb8.i[2] = local_1bb8._8_4_ & auVar113._8_4_;
                      local_1bb8.i[3] = local_1bb8._12_4_ & auVar113._12_4_;
                      local_1bb8.i[1] = local_1bb8._4_4_ & auVar113._4_4_;
                      local_1bb8.i[0] = local_1bb8._0_4_ & auVar113._0_4_;
                      uVar39 = movmskps(0,auVar130);
                      auVar126 = auVar130;
                    } while (uVar39 != 0);
                    local_1bb8._0_8_ = local_1bb8._0_8_ ^ 0xffffffffffffffff;
                    local_1bb8.i[2] = local_1bb8.i[2] ^ 0xffffffff;
                    local_1bb8.i[3] = local_1bb8.i[3] ^ 0xffffffff;
                  }
                  puVar41 = (undefined1 *)0x0;
                }
                else {
                  pRVar48 = *(RTCIntersectArguments **)(root.ptr & 0xfffffffffffffff0);
                  puVar41 = *(undefined1 **)pRVar48;
                  local_1bb8._8_8_ = uVar36;
                  local_1bb8._0_8_ = uVar35;
                  pre.super_Precalculations.grid = (GridSOA *)pRVar48;
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     ((undefined1  [16])local_1bb8 | (undefined1  [16])terminated.field_0);
                uVar39 = movmskps((int)pRVar48,(undefined1  [16])terminated.field_0);
                pRVar48 = (RTCIntersectArguments *)(ulong)uVar39;
                if (uVar39 == 0xf) goto LAB_00dc0f4a;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                              (undefined1  [16])terminated.field_0);
                if (puVar41 != (undefined1 *)0x0) {
                  pNVar58->ptr = (size_t)puVar41;
                  pNVar58 = pNVar58 + 1;
                  *(undefined8 *)paVar54 = 0xff800000ff800000;
                  *(float *)((long)paVar54 + 8) = -INFINITY;
                  *(float *)((long)paVar54 + 0xc) = -INFINITY;
                  paVar54 = paVar54 + 1;
                }
              }
              goto LAB_00dbf33f;
            }
            uVar42 = root.ptr & 0xfffffffffffffff0;
            pRVar48 = (RTCIntersectArguments *)&DAT_fffffffffffffff0;
            aVar97.i[1] = iVar250;
            aVar97.i[0] = iVar246;
            aVar97.i[2] = iVar254;
            aVar97.i[3] = iVar258;
            sVar50 = 8;
            do {
              sVar5 = *(size_t *)(uVar42 + 0x20 + (long)pRVar48 * 2);
              root.ptr = sVar50;
              if (sVar5 == 8) break;
              fVar80 = *(float *)((long)&pRVar48[4].filter + uVar42);
              fVar184 = *(float *)((long)&pRVar48[1].filter + uVar42);
              fVar192 = *(float *)((long)&pRVar48[2].flags + uVar42);
              fVar199 = *(float *)((long)&pRVar48[2].filter + uVar42);
              fVar158 = *(float *)((long)&pRVar48[3].flags + uVar42);
              fVar108 = *(float *)(ray + 0x70);
              fVar216 = *(float *)(ray + 0x74);
              fVar109 = *(float *)(ray + 0x78);
              fVar241 = *(float *)(ray + 0x7c);
              fVar139 = *(float *)((long)&pRVar48[5].filter + uVar42);
              fVar146 = *(float *)((long)&pRVar48[6].filter + uVar42);
              fVar147 = *(float *)((long)&pRVar48[3].filter + uVar42);
              fVar164 = *(float *)((long)&pRVar48[5].flags + uVar42);
              fVar166 = *(float *)((long)&pRVar48[6].flags + uVar42);
              fVar168 = *(float *)((long)&pRVar48[7].flags + uVar42);
              fVar96 = *(float *)((long)&pRVar48[4].flags + uVar42);
              fVar59 = ((fVar80 * fVar108 + fVar184) - (float)tray.org.field_0._0_4_) *
                       (float)tray.rdir.field_0._0_4_;
              fVar78 = ((fVar80 * fVar216 + fVar184) - (float)tray.org.field_0._4_4_) *
                       (float)tray.rdir.field_0._4_4_;
              fVar79 = ((fVar80 * fVar109 + fVar184) - (float)tray.org.field_0._8_4_) *
                       (float)tray.rdir.field_0._8_4_;
              fVar80 = ((fVar80 * fVar241 + fVar184) - (float)tray.org.field_0._12_4_) *
                       (float)tray.rdir.field_0._12_4_;
              fVar184 = ((fVar139 * fVar108 + fVar199) - (float)tray.org.field_0._16_4_) *
                        (float)tray.rdir.field_0._16_4_;
              fVar131 = ((fVar139 * fVar216 + fVar199) - (float)tray.org.field_0._20_4_) *
                        (float)tray.rdir.field_0._20_4_;
              fVar134 = ((fVar139 * fVar109 + fVar199) - (float)tray.org.field_0._24_4_) *
                        (float)tray.rdir.field_0._24_4_;
              fVar199 = ((fVar139 * fVar241 + fVar199) - (float)tray.org.field_0._28_4_) *
                        (float)tray.rdir.field_0._28_4_;
              fVar139 = ((fVar146 * fVar108 + fVar147) - (float)tray.org.field_0._32_4_) *
                        (float)tray.rdir.field_0._32_4_;
              fVar144 = ((fVar146 * fVar216 + fVar147) - (float)tray.org.field_0._36_4_) *
                        (float)tray.rdir.field_0._36_4_;
              fVar145 = ((fVar146 * fVar109 + fVar147) - (float)tray.org.field_0._40_4_) *
                        (float)tray.rdir.field_0._40_4_;
              fVar146 = ((fVar146 * fVar241 + fVar147) - (float)tray.org.field_0._44_4_) *
                        (float)tray.rdir.field_0._44_4_;
              fVar147 = ((fVar164 * fVar108 + fVar192) - (float)tray.org.field_0._0_4_) *
                        (float)tray.rdir.field_0._0_4_;
              fVar153 = ((fVar164 * fVar216 + fVar192) - (float)tray.org.field_0._4_4_) *
                        (float)tray.rdir.field_0._4_4_;
              fVar155 = ((fVar164 * fVar109 + fVar192) - (float)tray.org.field_0._8_4_) *
                        (float)tray.rdir.field_0._8_4_;
              fVar192 = ((fVar164 * fVar241 + fVar192) - (float)tray.org.field_0._12_4_) *
                        (float)tray.rdir.field_0._12_4_;
              fVar171 = ((fVar166 * fVar108 + fVar158) - (float)tray.org.field_0._16_4_) *
                        (float)tray.rdir.field_0._16_4_;
              fVar177 = ((fVar166 * fVar216 + fVar158) - (float)tray.org.field_0._20_4_) *
                        (float)tray.rdir.field_0._20_4_;
              fVar179 = ((fVar166 * fVar109 + fVar158) - (float)tray.org.field_0._24_4_) *
                        (float)tray.rdir.field_0._24_4_;
              fVar181 = ((fVar166 * fVar241 + fVar158) - (float)tray.org.field_0._28_4_) *
                        (float)tray.rdir.field_0._28_4_;
              fVar158 = ((fVar168 * fVar108 + fVar96) - (float)tray.org.field_0._32_4_) *
                        (float)tray.rdir.field_0._32_4_;
              fVar164 = ((fVar168 * fVar216 + fVar96) - (float)tray.org.field_0._36_4_) *
                        (float)tray.rdir.field_0._36_4_;
              fVar166 = ((fVar168 * fVar109 + fVar96) - (float)tray.org.field_0._40_4_) *
                        (float)tray.rdir.field_0._40_4_;
              fVar168 = ((fVar168 * fVar241 + fVar96) - (float)tray.org.field_0._44_4_) *
                        (float)tray.rdir.field_0._44_4_;
              uVar185 = (uint)((int)fVar147 < (int)fVar59) * (int)fVar147 |
                        (uint)((int)fVar147 >= (int)fVar59) * (int)fVar59;
              uVar193 = (uint)((int)fVar153 < (int)fVar78) * (int)fVar153 |
                        (uint)((int)fVar153 >= (int)fVar78) * (int)fVar78;
              uVar196 = (uint)((int)fVar155 < (int)fVar79) * (int)fVar155 |
                        (uint)((int)fVar155 >= (int)fVar79) * (int)fVar79;
              uVar200 = (uint)((int)fVar192 < (int)fVar80) * (int)fVar192 |
                        (uint)((int)fVar192 >= (int)fVar80) * (int)fVar80;
              uVar202 = (uint)((int)fVar171 < (int)fVar184) * (int)fVar171 |
                        (uint)((int)fVar171 >= (int)fVar184) * (int)fVar184;
              uVar207 = (uint)((int)fVar177 < (int)fVar131) * (int)fVar177 |
                        (uint)((int)fVar177 >= (int)fVar131) * (int)fVar131;
              uVar210 = (uint)((int)fVar179 < (int)fVar134) * (int)fVar179 |
                        (uint)((int)fVar179 >= (int)fVar134) * (int)fVar134;
              uVar213 = (uint)((int)fVar181 < (int)fVar199) * (int)fVar181 |
                        (uint)((int)fVar181 >= (int)fVar199) * (int)fVar199;
              uVar202 = ((int)uVar202 < (int)uVar185) * uVar185 |
                        ((int)uVar202 >= (int)uVar185) * uVar202;
              uVar207 = ((int)uVar207 < (int)uVar193) * uVar193 |
                        ((int)uVar207 >= (int)uVar193) * uVar207;
              uVar210 = ((int)uVar210 < (int)uVar196) * uVar196 |
                        ((int)uVar210 >= (int)uVar196) * uVar210;
              uVar213 = ((int)uVar213 < (int)uVar200) * uVar200 |
                        ((int)uVar213 >= (int)uVar200) * uVar213;
              uVar185 = (uint)((int)fVar158 < (int)fVar139) * (int)fVar158 |
                        (uint)((int)fVar158 >= (int)fVar139) * (int)fVar139;
              uVar193 = (uint)((int)fVar164 < (int)fVar144) * (int)fVar164 |
                        (uint)((int)fVar164 >= (int)fVar144) * (int)fVar144;
              uVar196 = (uint)((int)fVar166 < (int)fVar145) * (int)fVar166 |
                        (uint)((int)fVar166 >= (int)fVar145) * (int)fVar145;
              uVar200 = (uint)((int)fVar168 < (int)fVar146) * (int)fVar168 |
                        (uint)((int)fVar168 >= (int)fVar146) * (int)fVar146;
              auVar187._0_4_ =
                   ((int)uVar185 < (int)uVar202) * uVar202 |
                   ((int)uVar185 >= (int)uVar202) * uVar185;
              auVar187._4_4_ =
                   ((int)uVar193 < (int)uVar207) * uVar207 |
                   ((int)uVar193 >= (int)uVar207) * uVar193;
              auVar187._8_4_ =
                   ((int)uVar196 < (int)uVar210) * uVar210 |
                   ((int)uVar196 >= (int)uVar210) * uVar196;
              auVar187._12_4_ =
                   ((int)uVar200 < (int)uVar213) * uVar213 |
                   ((int)uVar200 >= (int)uVar213) * uVar200;
              uVar185 = (uint)((int)fVar147 < (int)fVar59) * (int)fVar59 |
                        (uint)((int)fVar147 >= (int)fVar59) * (int)fVar147;
              uVar193 = (uint)((int)fVar153 < (int)fVar78) * (int)fVar78 |
                        (uint)((int)fVar153 >= (int)fVar78) * (int)fVar153;
              uVar196 = (uint)((int)fVar155 < (int)fVar79) * (int)fVar79 |
                        (uint)((int)fVar155 >= (int)fVar79) * (int)fVar155;
              uVar200 = (uint)((int)fVar192 < (int)fVar80) * (int)fVar80 |
                        (uint)((int)fVar192 >= (int)fVar80) * (int)fVar192;
              uVar202 = (uint)((int)fVar171 < (int)fVar184) * (int)fVar184 |
                        (uint)((int)fVar171 >= (int)fVar184) * (int)fVar171;
              uVar207 = (uint)((int)fVar177 < (int)fVar131) * (int)fVar131 |
                        (uint)((int)fVar177 >= (int)fVar131) * (int)fVar177;
              uVar210 = (uint)((int)fVar179 < (int)fVar134) * (int)fVar134 |
                        (uint)((int)fVar179 >= (int)fVar134) * (int)fVar179;
              uVar213 = (uint)((int)fVar181 < (int)fVar199) * (int)fVar199 |
                        (uint)((int)fVar181 >= (int)fVar199) * (int)fVar181;
              uVar202 = ((int)uVar185 < (int)uVar202) * uVar185 |
                        ((int)uVar185 >= (int)uVar202) * uVar202;
              uVar207 = ((int)uVar193 < (int)uVar207) * uVar193 |
                        ((int)uVar193 >= (int)uVar207) * uVar207;
              uVar210 = ((int)uVar196 < (int)uVar210) * uVar196 |
                        ((int)uVar196 >= (int)uVar210) * uVar210;
              uVar213 = ((int)uVar200 < (int)uVar213) * uVar200 |
                        ((int)uVar200 >= (int)uVar213) * uVar213;
              uVar185 = (uint)((int)fVar158 < (int)fVar139) * (int)fVar139 |
                        (uint)((int)fVar158 >= (int)fVar139) * (int)fVar158;
              uVar193 = (uint)((int)fVar164 < (int)fVar144) * (int)fVar144 |
                        (uint)((int)fVar164 >= (int)fVar144) * (int)fVar164;
              uVar196 = (uint)((int)fVar166 < (int)fVar145) * (int)fVar145 |
                        (uint)((int)fVar166 >= (int)fVar145) * (int)fVar166;
              uVar200 = (uint)((int)fVar168 < (int)fVar146) * (int)fVar146 |
                        (uint)((int)fVar168 >= (int)fVar146) * (int)fVar168;
              uVar185 = ((int)uVar202 < (int)uVar185) * uVar202 |
                        ((int)uVar202 >= (int)uVar185) * uVar185;
              uVar193 = ((int)uVar207 < (int)uVar193) * uVar207 |
                        ((int)uVar207 >= (int)uVar193) * uVar193;
              uVar196 = ((int)uVar210 < (int)uVar196) * uVar210 |
                        ((int)uVar210 >= (int)uVar196) * uVar196;
              uVar200 = ((int)uVar213 < (int)uVar200) * uVar213 |
                        ((int)uVar213 >= (int)uVar200) * uVar200;
              bVar38 = (float)((tray.tnear.field_0.i[0] < (int)auVar187._0_4_) * auVar187._0_4_ |
                              (uint)(tray.tnear.field_0.i[0] >= (int)auVar187._0_4_) *
                              tray.tnear.field_0.i[0]) <=
                       (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar185) *
                               tray.tfar.field_0.i[0] |
                              (tray.tfar.field_0.i[0] >= (int)uVar185) * uVar185);
              bVar9 = (float)((tray.tnear.field_0.i[1] < (int)auVar187._4_4_) * auVar187._4_4_ |
                             (uint)(tray.tnear.field_0.i[1] >= (int)auVar187._4_4_) *
                             tray.tnear.field_0.i[1]) <=
                      (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar193) * tray.tfar.field_0.i[1]
                             | (tray.tfar.field_0.i[1] >= (int)uVar193) * uVar193);
              bVar10 = (float)((tray.tnear.field_0.i[2] < (int)auVar187._8_4_) * auVar187._8_4_ |
                              (uint)(tray.tnear.field_0.i[2] >= (int)auVar187._8_4_) *
                              tray.tnear.field_0.i[2]) <=
                       (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar196) *
                               tray.tfar.field_0.i[2] |
                              (tray.tfar.field_0.i[2] >= (int)uVar196) * uVar196);
              bVar11 = (float)((tray.tnear.field_0.i[3] < (int)auVar187._12_4_) * auVar187._12_4_ |
                              (uint)(tray.tnear.field_0.i[3] >= (int)auVar187._12_4_) *
                              tray.tnear.field_0.i[3]) <=
                       (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar200) *
                               tray.tfar.field_0.i[3] |
                              (tray.tfar.field_0.i[3] >= (int)uVar200) * uVar200);
              if ((uVar39 & 7) == 6) {
                fVar80 = *(float *)((long)&pRVar48[7].filter + uVar42);
                fVar184 = *(float *)((long)&pRVar48[8].flags + uVar42);
                bVar38 = (fVar108 < fVar184 && fVar80 <= fVar108) && bVar38;
                bVar9 = (fVar216 < fVar184 && fVar80 <= fVar216) && bVar9;
                bVar10 = (fVar109 < fVar184 && fVar80 <= fVar109) && bVar10;
                bVar11 = (fVar241 < fVar184 && fVar80 <= fVar241) && bVar11;
              }
              auVar62._0_4_ = (-(uint)bVar38 & -(uint)(fVar183 < tray.tfar.field_0.v[0])) << 0x1f;
              auVar62._4_4_ = (-(uint)bVar9 & -(uint)(fVar191 < tray.tfar.field_0.v[1])) << 0x1f;
              auVar62._8_4_ = (-(uint)bVar10 & -(uint)(fVar195 < tray.tfar.field_0.v[2])) << 0x1f;
              auVar62._12_4_ = (-(uint)bVar11 & -(uint)(fVar198 < tray.tfar.field_0.v[3])) << 0x1f;
              uVar185 = movmskps((int)valid_i,auVar62);
              valid_i = (vint<4> *)(ulong)uVar185;
              aVar115 = aVar97;
              if ((uVar185 != 0) &&
                 (auVar114._4_4_ = iVar250, auVar114._0_4_ = iVar246, auVar114._8_4_ = iVar254,
                 auVar114._12_4_ = iVar258,
                 aVar115 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           blendvps(auVar114,auVar187,auVar62), root.ptr = sVar5, sVar50 != 8)) {
                pNVar58->ptr = sVar50;
                pNVar58 = pNVar58 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar54->v = aVar97;
                paVar54 = paVar54 + 1;
              }
              aVar97 = aVar115;
              pRVar48 = (RTCIntersectArguments *)&pRVar48->feature_mask;
              sVar50 = root.ptr;
            } while (pRVar48 != (RTCIntersectArguments *)0x0);
            puVar41 = (undefined1 *)0x4;
            if (root.ptr == 8) goto LAB_00dbf63f;
            auVar63._4_4_ = -(uint)(aVar97.v[1] < tray.tfar.field_0.v[1]);
            auVar63._0_4_ = -(uint)(aVar97.v[0] < tray.tfar.field_0.v[0]);
            auVar63._8_4_ = -(uint)(aVar97.v[2] < tray.tfar.field_0.v[2]);
            auVar63._12_4_ = -(uint)(aVar97.v[3] < tray.tfar.field_0.v[3]);
            uVar47 = movmskps((int)pRVar48,auVar63);
            pRVar48 = (RTCIntersectArguments *)(ulong)(uint)POPCOUNT(uVar47);
          } while ((byte)uVar46 < (byte)POPCOUNT(uVar47));
          pNVar58->ptr = root.ptr;
          pNVar58 = pNVar58 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar54->v = aVar97;
          paVar54 = paVar54 + 1;
        }
        else {
          do {
            pRVar4 = (RTCIntersectArguments *)0x0;
            if (uVar42 != 0) {
              for (; (uVar42 >> (long)pRVar4 & 1) == 0;
                  pRVar4 = (RTCIntersectArguments *)((long)&pRVar4->flags + 1)) {
              }
            }
            pRVar48 = pRVar4;
            valid_i = (vint<4> *)This;
            bVar38 = occluded1(This,bvh,root,(size_t)pRVar4,&pre,ray,&tray,context);
            if (bVar38) {
              terminated.field_0.i[(long)pRVar4] = -1;
            }
            uVar49 = uVar42 - 1;
            uVar42 = uVar42 & uVar49;
          } while (uVar42 != 0);
          iVar246 = movmskps((int)uVar49,(undefined1  [16])terminated.field_0);
          if (iVar246 == 0xf) {
            puVar41 = (undefined1 *)0x3;
          }
          else {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                          (undefined1  [16])terminated.field_0);
            puVar41 = (undefined1 *)0x2;
          }
          iVar246 = 0x7f800000;
          iVar250 = 0x7f800000;
          iVar254 = 0x7f800000;
          iVar258 = 0x7f800000;
          if (uVar46 < (uint)POPCOUNT(uVar39 & 0xff)) goto LAB_00dbf389;
        }
LAB_00dbf63f:
      } while (((int)puVar41 == 4) || ((int)puVar41 == 2));
LAB_00dc0f4a:
      auVar77._4_4_ = uVar176 & terminated.field_0.i[1];
      auVar77._0_4_ = uVar170 & terminated.field_0.i[0];
      auVar77._8_4_ = auVar173._8_4_ & terminated.field_0.i[2];
      auVar77._12_4_ = auVar173._12_4_ & terminated.field_0.i[3];
      auVar113 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa00,auVar77);
      *(undefined1 (*) [16])(ray + 0x80) = auVar113;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }